

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

bool embree::sse2::CurveNiMBIntersectorK<4,4>::
     occluded_t<embree::sse2::RibbonCurve1IntersectorK<embree::CatmullRomCurveT,4,4>,embree::sse2::Occluded1KEpilogMU<4,4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  Primitive *pPVar7;
  undefined1 (*pauVar8) [16];
  undefined1 (*pauVar9) [16];
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  Primitive PVar18;
  int iVar19;
  Geometry *pGVar20;
  __int_type_conflict _Var21;
  long lVar22;
  long lVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined6 uVar26;
  undefined1 auVar27 [12];
  undefined1 auVar28 [12];
  undefined1 auVar29 [12];
  undefined1 auVar30 [12];
  undefined1 auVar31 [12];
  undefined1 auVar32 [12];
  undefined1 auVar33 [12];
  undefined1 auVar34 [12];
  undefined1 auVar35 [12];
  undefined1 auVar36 [12];
  undefined1 auVar37 [12];
  undefined1 auVar38 [12];
  undefined1 auVar39 [12];
  undefined1 auVar40 [12];
  undefined1 auVar41 [12];
  undefined1 auVar42 [12];
  undefined1 auVar43 [12];
  undefined1 auVar44 [12];
  undefined1 auVar45 [12];
  undefined1 auVar46 [12];
  undefined1 auVar47 [12];
  bool bVar48;
  bool bVar49;
  bool bVar50;
  bool bVar51;
  undefined4 uVar52;
  int iVar53;
  ulong uVar54;
  RTCFilterFunctionN p_Var55;
  RTCRayN *pRVar56;
  undefined4 uVar57;
  RTCIntersectArguments *pRVar58;
  undefined1 *puVar59;
  ulong uVar60;
  Geometry *pGVar61;
  ulong uVar62;
  bool bVar63;
  ulong uVar64;
  Geometry *geometry;
  long lVar65;
  uint uVar66;
  uint uVar67;
  uint uVar68;
  uint uVar69;
  uint uVar70;
  uint uVar71;
  short sVar72;
  undefined2 uVar102;
  float fVar73;
  float fVar74;
  float fVar103;
  float fVar105;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar79 [16];
  undefined1 auVar82 [16];
  undefined1 auVar85 [16];
  undefined1 auVar88 [16];
  undefined1 auVar91 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  float fVar104;
  float fVar106;
  undefined8 uVar107;
  float fVar108;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  float fVar109;
  float fVar110;
  float fVar132;
  float fVar134;
  vfloat4 v_2;
  undefined1 auVar111 [16];
  undefined1 auVar114 [16];
  undefined1 auVar117 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  float fVar133;
  float fVar135;
  float fVar136;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  float fVar137;
  float fVar144;
  float fVar146;
  vfloat4 v;
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  float fVar138;
  float fVar145;
  float fVar147;
  float fVar148;
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  float fVar149;
  float fVar160;
  float fVar161;
  vfloat4 v_1;
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  float fVar162;
  float fVar172;
  float fVar173;
  undefined1 auVar163 [16];
  float fVar174;
  float fVar175;
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  float fVar176;
  float fVar177;
  float fVar199;
  float fVar201;
  undefined1 auVar178 [16];
  undefined1 auVar181 [16];
  undefined1 auVar184 [16];
  undefined1 auVar187 [16];
  undefined1 auVar190 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  float fVar200;
  float fVar202;
  float fVar203;
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  float fVar204;
  float fVar205;
  float fVar209;
  float fVar211;
  undefined1 auVar206 [16];
  float fVar210;
  float fVar212;
  float fVar213;
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  float fVar214;
  float fVar221;
  float fVar222;
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  float fVar223;
  float fVar226;
  float fVar227;
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  float fVar228;
  float fVar235;
  float fVar236;
  undefined1 auVar229 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  float fVar237;
  float fVar238;
  float fVar246;
  float fVar247;
  float fVar248;
  float fVar249;
  undefined1 auVar239 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  float fVar250;
  float fVar251;
  float fVar258;
  float fVar259;
  float fVar260;
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  float fVar261;
  float fVar269;
  float fVar271;
  float fVar273;
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  float fVar270;
  float fVar272;
  float fVar274;
  undefined1 auVar268 [16];
  float fVar275;
  float fVar276;
  float fVar282;
  float fVar283;
  float fVar284;
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  float fVar285;
  float fVar289;
  float fVar290;
  float fVar291;
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  float fVar292;
  float fVar293;
  float fVar294;
  float fVar295;
  float fVar296;
  float fVar297;
  float fVar298;
  float fVar299;
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::CatmullRomCurveT<embree::Vec3fx>,_4> bhit;
  float local_4a8;
  float fStack_4a4;
  float fStack_4a0;
  float fStack_49c;
  float local_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  undefined4 uStack_46c;
  float local_448;
  undefined8 local_428;
  undefined8 uStack_420;
  float local_3e8;
  float fStack_3e4;
  float fStack_3e0;
  float fStack_3dc;
  float local_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  undefined1 local_3c8 [16];
  ulong local_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  float local_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  undefined1 local_388 [8];
  float fStack_380;
  float local_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  float local_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  undefined1 (*local_348) [16];
  Precalculations *local_340;
  RTCFilterFunctionNArguments local_338;
  undefined1 local_308 [16];
  undefined8 local_2f8;
  float fStack_2f0;
  float fStack_2ec;
  float local_2e8;
  float fStack_2e4;
  float fStack_2e0;
  float fStack_2dc;
  float local_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float local_2c8;
  float fStack_2c4;
  float fStack_2c0;
  float fStack_2bc;
  float local_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  undefined1 local_2a8 [8];
  float fStack_2a0;
  float fStack_29c;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  undefined1 local_268 [8];
  float fStack_260;
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  LinearSpace3fa *local_238;
  Primitive *local_230;
  float local_228;
  float fStack_224;
  float fStack_220;
  float fStack_21c;
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float local_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  float local_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  uint local_198;
  int local_194;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined1 local_148 [16];
  float local_138 [4];
  undefined8 local_128;
  undefined8 uStack_120;
  float local_118 [4];
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  undefined4 local_c8;
  undefined4 uStack_c4;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  uint local_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint local_88;
  uint uStack_84;
  uint uStack_80;
  uint uStack_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  int local_58;
  int iStack_54;
  int iStack_50;
  int iStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 uVar101;
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  
  PVar18 = prim[1];
  uVar54 = (ulong)(byte)PVar18;
  lVar23 = uVar54 * 0x25;
  pPVar7 = prim + lVar23 + 6;
  fVar146 = *(float *)(pPVar7 + 0xc);
  fVar149 = (*(float *)(ray + k * 4) - *(float *)pPVar7) * fVar146;
  fVar160 = (*(float *)(ray + k * 4 + 0x10) - *(float *)(pPVar7 + 4)) * fVar146;
  fVar161 = (*(float *)(ray + k * 4 + 0x20) - *(float *)(pPVar7 + 8)) * fVar146;
  fVar137 = *(float *)(ray + k * 4 + 0x40) * fVar146;
  fVar144 = *(float *)(ray + k * 4 + 0x50) * fVar146;
  fVar146 = *(float *)(ray + k * 4 + 0x60) * fVar146;
  uVar57 = *(undefined4 *)(prim + uVar54 * 4 + 6);
  uVar101 = (undefined1)((uint)uVar57 >> 0x18);
  uVar102 = CONCAT11(uVar101,uVar101);
  uVar101 = (undefined1)((uint)uVar57 >> 0x10);
  uVar107 = CONCAT35(CONCAT21(uVar102,uVar101),CONCAT14(uVar101,uVar57));
  uVar101 = (undefined1)((uint)uVar57 >> 8);
  uVar26 = CONCAT51(CONCAT41((int)((ulong)uVar107 >> 0x20),uVar101),uVar101);
  sVar72 = CONCAT11((char)uVar57,(char)uVar57);
  uVar62 = CONCAT62(uVar26,sVar72);
  auVar140._8_4_ = 0;
  auVar140._0_8_ = uVar62;
  auVar140._12_2_ = uVar102;
  auVar140._14_2_ = uVar102;
  uVar102 = (undefined2)((ulong)uVar107 >> 0x20);
  auVar233._12_4_ = auVar140._12_4_;
  auVar233._8_2_ = 0;
  auVar233._0_8_ = uVar62;
  auVar233._10_2_ = uVar102;
  auVar75._10_6_ = auVar233._10_6_;
  auVar75._8_2_ = uVar102;
  auVar75._0_8_ = uVar62;
  uVar102 = (undefined2)uVar26;
  auVar27._4_8_ = auVar75._8_8_;
  auVar27._2_2_ = uVar102;
  auVar27._0_2_ = uVar102;
  fVar275 = (float)((int)sVar72 >> 8);
  fVar282 = (float)(auVar27._0_4_ >> 0x18);
  fVar283 = (float)(auVar75._8_4_ >> 0x18);
  uVar57 = *(undefined4 *)(prim + uVar54 * 5 + 6);
  uVar101 = (undefined1)((uint)uVar57 >> 0x18);
  uVar102 = CONCAT11(uVar101,uVar101);
  uVar101 = (undefined1)((uint)uVar57 >> 0x10);
  uVar107 = CONCAT35(CONCAT21(uVar102,uVar101),CONCAT14(uVar101,uVar57));
  uVar101 = (undefined1)((uint)uVar57 >> 8);
  uVar26 = CONCAT51(CONCAT41((int)((ulong)uVar107 >> 0x20),uVar101),uVar101);
  sVar72 = CONCAT11((char)uVar57,(char)uVar57);
  uVar62 = CONCAT62(uVar26,sVar72);
  auVar113._8_4_ = 0;
  auVar113._0_8_ = uVar62;
  auVar113._12_2_ = uVar102;
  auVar113._14_2_ = uVar102;
  uVar102 = (undefined2)((ulong)uVar107 >> 0x20);
  auVar112._12_4_ = auVar113._12_4_;
  auVar112._8_2_ = 0;
  auVar112._0_8_ = uVar62;
  auVar112._10_2_ = uVar102;
  auVar111._10_6_ = auVar112._10_6_;
  auVar111._8_2_ = uVar102;
  auVar111._0_8_ = uVar62;
  uVar102 = (undefined2)uVar26;
  auVar28._4_8_ = auVar111._8_8_;
  auVar28._2_2_ = uVar102;
  auVar28._0_2_ = uVar102;
  fVar162 = (float)((int)sVar72 >> 8);
  fVar172 = (float)(auVar28._0_4_ >> 0x18);
  fVar173 = (float)(auVar111._8_4_ >> 0x18);
  uVar57 = *(undefined4 *)(prim + uVar54 * 6 + 6);
  uVar101 = (undefined1)((uint)uVar57 >> 0x18);
  uVar102 = CONCAT11(uVar101,uVar101);
  uVar101 = (undefined1)((uint)uVar57 >> 0x10);
  uVar107 = CONCAT35(CONCAT21(uVar102,uVar101),CONCAT14(uVar101,uVar57));
  uVar101 = (undefined1)((uint)uVar57 >> 8);
  uVar26 = CONCAT51(CONCAT41((int)((ulong)uVar107 >> 0x20),uVar101),uVar101);
  sVar72 = CONCAT11((char)uVar57,(char)uVar57);
  uVar62 = CONCAT62(uVar26,sVar72);
  auVar116._8_4_ = 0;
  auVar116._0_8_ = uVar62;
  auVar116._12_2_ = uVar102;
  auVar116._14_2_ = uVar102;
  uVar102 = (undefined2)((ulong)uVar107 >> 0x20);
  auVar115._12_4_ = auVar116._12_4_;
  auVar115._8_2_ = 0;
  auVar115._0_8_ = uVar62;
  auVar115._10_2_ = uVar102;
  auVar114._10_6_ = auVar115._10_6_;
  auVar114._8_2_ = uVar102;
  auVar114._0_8_ = uVar62;
  uVar102 = (undefined2)uVar26;
  auVar29._4_8_ = auVar114._8_8_;
  auVar29._2_2_ = uVar102;
  auVar29._0_2_ = uVar102;
  fVar204 = (float)((int)sVar72 >> 8);
  fVar209 = (float)(auVar29._0_4_ >> 0x18);
  fVar211 = (float)(auVar114._8_4_ >> 0x18);
  uVar57 = *(undefined4 *)(prim + uVar54 * 0xf + 6);
  uVar101 = (undefined1)((uint)uVar57 >> 0x18);
  uVar102 = CONCAT11(uVar101,uVar101);
  uVar101 = (undefined1)((uint)uVar57 >> 0x10);
  uVar107 = CONCAT35(CONCAT21(uVar102,uVar101),CONCAT14(uVar101,uVar57));
  uVar101 = (undefined1)((uint)uVar57 >> 8);
  uVar26 = CONCAT51(CONCAT41((int)((ulong)uVar107 >> 0x20),uVar101),uVar101);
  sVar72 = CONCAT11((char)uVar57,(char)uVar57);
  uVar62 = CONCAT62(uVar26,sVar72);
  auVar119._8_4_ = 0;
  auVar119._0_8_ = uVar62;
  auVar119._12_2_ = uVar102;
  auVar119._14_2_ = uVar102;
  uVar102 = (undefined2)((ulong)uVar107 >> 0x20);
  auVar118._12_4_ = auVar119._12_4_;
  auVar118._8_2_ = 0;
  auVar118._0_8_ = uVar62;
  auVar118._10_2_ = uVar102;
  auVar117._10_6_ = auVar118._10_6_;
  auVar117._8_2_ = uVar102;
  auVar117._0_8_ = uVar62;
  uVar102 = (undefined2)uVar26;
  auVar30._4_8_ = auVar117._8_8_;
  auVar30._2_2_ = uVar102;
  auVar30._0_2_ = uVar102;
  fVar73 = (float)((int)sVar72 >> 8);
  fVar103 = (float)(auVar30._0_4_ >> 0x18);
  fVar105 = (float)(auVar117._8_4_ >> 0x18);
  uVar57 = *(undefined4 *)(prim + (ulong)(byte)PVar18 * 0x10 + 6);
  uVar101 = (undefined1)((uint)uVar57 >> 0x18);
  uVar102 = CONCAT11(uVar101,uVar101);
  uVar101 = (undefined1)((uint)uVar57 >> 0x10);
  uVar107 = CONCAT35(CONCAT21(uVar102,uVar101),CONCAT14(uVar101,uVar57));
  uVar101 = (undefined1)((uint)uVar57 >> 8);
  uVar26 = CONCAT51(CONCAT41((int)((ulong)uVar107 >> 0x20),uVar101),uVar101);
  sVar72 = CONCAT11((char)uVar57,(char)uVar57);
  uVar62 = CONCAT62(uVar26,sVar72);
  auVar180._8_4_ = 0;
  auVar180._0_8_ = uVar62;
  auVar180._12_2_ = uVar102;
  auVar180._14_2_ = uVar102;
  uVar102 = (undefined2)((ulong)uVar107 >> 0x20);
  auVar179._12_4_ = auVar180._12_4_;
  auVar179._8_2_ = 0;
  auVar179._0_8_ = uVar62;
  auVar179._10_2_ = uVar102;
  auVar178._10_6_ = auVar179._10_6_;
  auVar178._8_2_ = uVar102;
  auVar178._0_8_ = uVar62;
  uVar102 = (undefined2)uVar26;
  auVar31._4_8_ = auVar178._8_8_;
  auVar31._2_2_ = uVar102;
  auVar31._0_2_ = uVar102;
  fVar214 = (float)((int)sVar72 >> 8);
  fVar221 = (float)(auVar31._0_4_ >> 0x18);
  fVar222 = (float)(auVar178._8_4_ >> 0x18);
  uVar57 = *(undefined4 *)(prim + (ulong)(byte)PVar18 * 0x10 + uVar54 + 6);
  uVar101 = (undefined1)((uint)uVar57 >> 0x18);
  uVar102 = CONCAT11(uVar101,uVar101);
  uVar101 = (undefined1)((uint)uVar57 >> 0x10);
  uVar107 = CONCAT35(CONCAT21(uVar102,uVar101),CONCAT14(uVar101,uVar57));
  uVar101 = (undefined1)((uint)uVar57 >> 8);
  uVar26 = CONCAT51(CONCAT41((int)((ulong)uVar107 >> 0x20),uVar101),uVar101);
  sVar72 = CONCAT11((char)uVar57,(char)uVar57);
  uVar62 = CONCAT62(uVar26,sVar72);
  auVar183._8_4_ = 0;
  auVar183._0_8_ = uVar62;
  auVar183._12_2_ = uVar102;
  auVar183._14_2_ = uVar102;
  uVar102 = (undefined2)((ulong)uVar107 >> 0x20);
  auVar182._12_4_ = auVar183._12_4_;
  auVar182._8_2_ = 0;
  auVar182._0_8_ = uVar62;
  auVar182._10_2_ = uVar102;
  auVar181._10_6_ = auVar182._10_6_;
  auVar181._8_2_ = uVar102;
  auVar181._0_8_ = uVar62;
  uVar102 = (undefined2)uVar26;
  auVar32._4_8_ = auVar181._8_8_;
  auVar32._2_2_ = uVar102;
  auVar32._0_2_ = uVar102;
  fVar228 = (float)((int)sVar72 >> 8);
  fVar235 = (float)(auVar32._0_4_ >> 0x18);
  fVar236 = (float)(auVar181._8_4_ >> 0x18);
  uVar57 = *(undefined4 *)(prim + uVar54 * 0x1a + 6);
  uVar101 = (undefined1)((uint)uVar57 >> 0x18);
  uVar102 = CONCAT11(uVar101,uVar101);
  uVar101 = (undefined1)((uint)uVar57 >> 0x10);
  uVar107 = CONCAT35(CONCAT21(uVar102,uVar101),CONCAT14(uVar101,uVar57));
  uVar101 = (undefined1)((uint)uVar57 >> 8);
  uVar26 = CONCAT51(CONCAT41((int)((ulong)uVar107 >> 0x20),uVar101),uVar101);
  sVar72 = CONCAT11((char)uVar57,(char)uVar57);
  uVar62 = CONCAT62(uVar26,sVar72);
  auVar186._8_4_ = 0;
  auVar186._0_8_ = uVar62;
  auVar186._12_2_ = uVar102;
  auVar186._14_2_ = uVar102;
  uVar102 = (undefined2)((ulong)uVar107 >> 0x20);
  auVar185._12_4_ = auVar186._12_4_;
  auVar185._8_2_ = 0;
  auVar185._0_8_ = uVar62;
  auVar185._10_2_ = uVar102;
  auVar184._10_6_ = auVar185._10_6_;
  auVar184._8_2_ = uVar102;
  auVar184._0_8_ = uVar62;
  uVar102 = (undefined2)uVar26;
  auVar33._4_8_ = auVar184._8_8_;
  auVar33._2_2_ = uVar102;
  auVar33._0_2_ = uVar102;
  fVar223 = (float)((int)sVar72 >> 8);
  fVar226 = (float)(auVar33._0_4_ >> 0x18);
  fVar227 = (float)(auVar184._8_4_ >> 0x18);
  uVar57 = *(undefined4 *)(prim + uVar54 * 0x1b + 6);
  uVar101 = (undefined1)((uint)uVar57 >> 0x18);
  uVar102 = CONCAT11(uVar101,uVar101);
  uVar101 = (undefined1)((uint)uVar57 >> 0x10);
  uVar107 = CONCAT35(CONCAT21(uVar102,uVar101),CONCAT14(uVar101,uVar57));
  uVar101 = (undefined1)((uint)uVar57 >> 8);
  uVar26 = CONCAT51(CONCAT41((int)((ulong)uVar107 >> 0x20),uVar101),uVar101);
  sVar72 = CONCAT11((char)uVar57,(char)uVar57);
  uVar62 = CONCAT62(uVar26,sVar72);
  auVar189._8_4_ = 0;
  auVar189._0_8_ = uVar62;
  auVar189._12_2_ = uVar102;
  auVar189._14_2_ = uVar102;
  uVar102 = (undefined2)((ulong)uVar107 >> 0x20);
  auVar188._12_4_ = auVar189._12_4_;
  auVar188._8_2_ = 0;
  auVar188._0_8_ = uVar62;
  auVar188._10_2_ = uVar102;
  auVar187._10_6_ = auVar188._10_6_;
  auVar187._8_2_ = uVar102;
  auVar187._0_8_ = uVar62;
  uVar102 = (undefined2)uVar26;
  auVar34._4_8_ = auVar187._8_8_;
  auVar34._2_2_ = uVar102;
  auVar34._0_2_ = uVar102;
  fVar237 = (float)((int)sVar72 >> 8);
  fVar246 = (float)(auVar34._0_4_ >> 0x18);
  fVar248 = (float)(auVar187._8_4_ >> 0x18);
  uVar57 = *(undefined4 *)(prim + uVar54 * 0x1c + 6);
  uVar101 = (undefined1)((uint)uVar57 >> 0x18);
  uVar102 = CONCAT11(uVar101,uVar101);
  uVar101 = (undefined1)((uint)uVar57 >> 0x10);
  uVar107 = CONCAT35(CONCAT21(uVar102,uVar101),CONCAT14(uVar101,uVar57));
  uVar101 = (undefined1)((uint)uVar57 >> 8);
  uVar26 = CONCAT51(CONCAT41((int)((ulong)uVar107 >> 0x20),uVar101),uVar101);
  sVar72 = CONCAT11((char)uVar57,(char)uVar57);
  uVar62 = CONCAT62(uVar26,sVar72);
  auVar192._8_4_ = 0;
  auVar192._0_8_ = uVar62;
  auVar192._12_2_ = uVar102;
  auVar192._14_2_ = uVar102;
  uVar102 = (undefined2)((ulong)uVar107 >> 0x20);
  auVar191._12_4_ = auVar192._12_4_;
  auVar191._8_2_ = 0;
  auVar191._0_8_ = uVar62;
  auVar191._10_2_ = uVar102;
  auVar190._10_6_ = auVar191._10_6_;
  auVar190._8_2_ = uVar102;
  auVar190._0_8_ = uVar62;
  uVar102 = (undefined2)uVar26;
  auVar35._4_8_ = auVar190._8_8_;
  auVar35._2_2_ = uVar102;
  auVar35._0_2_ = uVar102;
  fVar109 = (float)((int)sVar72 >> 8);
  fVar132 = (float)(auVar35._0_4_ >> 0x18);
  fVar134 = (float)(auVar190._8_4_ >> 0x18);
  fVar261 = fVar137 * fVar275 + fVar144 * fVar162 + fVar146 * fVar204;
  fVar269 = fVar137 * fVar282 + fVar144 * fVar172 + fVar146 * fVar209;
  fVar271 = fVar137 * fVar283 + fVar144 * fVar173 + fVar146 * fVar211;
  fVar273 = fVar137 * (float)(auVar233._12_4_ >> 0x18) +
            fVar144 * (float)(auVar112._12_4_ >> 0x18) + fVar146 * (float)(auVar115._12_4_ >> 0x18);
  fVar251 = fVar137 * fVar73 + fVar144 * fVar214 + fVar146 * fVar228;
  fVar258 = fVar137 * fVar103 + fVar144 * fVar221 + fVar146 * fVar235;
  fVar259 = fVar137 * fVar105 + fVar144 * fVar222 + fVar146 * fVar236;
  fVar260 = fVar137 * (float)(auVar118._12_4_ >> 0x18) +
            fVar144 * (float)(auVar179._12_4_ >> 0x18) + fVar146 * (float)(auVar182._12_4_ >> 0x18);
  fVar176 = fVar137 * fVar223 + fVar144 * fVar237 + fVar146 * fVar109;
  fVar199 = fVar137 * fVar226 + fVar144 * fVar246 + fVar146 * fVar132;
  fVar201 = fVar137 * fVar227 + fVar144 * fVar248 + fVar146 * fVar134;
  fVar137 = fVar137 * (float)(auVar185._12_4_ >> 0x18) +
            fVar144 * (float)(auVar188._12_4_ >> 0x18) + fVar146 * (float)(auVar191._12_4_ >> 0x18);
  fVar276 = fVar275 * fVar149 + fVar162 * fVar160 + fVar204 * fVar161;
  fVar282 = fVar282 * fVar149 + fVar172 * fVar160 + fVar209 * fVar161;
  fVar283 = fVar283 * fVar149 + fVar173 * fVar160 + fVar211 * fVar161;
  fVar284 = (float)(auVar233._12_4_ >> 0x18) * fVar149 +
            (float)(auVar112._12_4_ >> 0x18) * fVar160 + (float)(auVar115._12_4_ >> 0x18) * fVar161;
  fVar228 = fVar73 * fVar149 + fVar214 * fVar160 + fVar228 * fVar161;
  fVar235 = fVar103 * fVar149 + fVar221 * fVar160 + fVar235 * fVar161;
  fVar236 = fVar105 * fVar149 + fVar222 * fVar160 + fVar236 * fVar161;
  fVar275 = (float)(auVar118._12_4_ >> 0x18) * fVar149 +
            (float)(auVar179._12_4_ >> 0x18) * fVar160 + (float)(auVar182._12_4_ >> 0x18) * fVar161;
  fVar223 = fVar149 * fVar223 + fVar160 * fVar237 + fVar161 * fVar109;
  fVar226 = fVar149 * fVar226 + fVar160 * fVar246 + fVar161 * fVar132;
  fVar227 = fVar149 * fVar227 + fVar160 * fVar248 + fVar161 * fVar134;
  fVar237 = fVar149 * (float)(auVar185._12_4_ >> 0x18) +
            fVar160 * (float)(auVar188._12_4_ >> 0x18) + fVar161 * (float)(auVar191._12_4_ >> 0x18);
  fVar146 = (float)DAT_01f80d30;
  fVar73 = DAT_01f80d30._4_4_;
  fVar103 = DAT_01f80d30._8_4_;
  fVar105 = DAT_01f80d30._12_4_;
  uVar66 = -(uint)(fVar146 <= ABS(fVar261));
  uVar67 = -(uint)(fVar73 <= ABS(fVar269));
  uVar68 = -(uint)(fVar103 <= ABS(fVar271));
  uVar69 = -(uint)(fVar105 <= ABS(fVar273));
  auVar262._0_4_ = (uint)fVar261 & uVar66;
  auVar262._4_4_ = (uint)fVar269 & uVar67;
  auVar262._8_4_ = (uint)fVar271 & uVar68;
  auVar262._12_4_ = (uint)fVar273 & uVar69;
  auVar150._0_4_ = ~uVar66 & (uint)fVar146;
  auVar150._4_4_ = ~uVar67 & (uint)fVar73;
  auVar150._8_4_ = ~uVar68 & (uint)fVar103;
  auVar150._12_4_ = ~uVar69 & (uint)fVar105;
  auVar150 = auVar150 | auVar262;
  uVar66 = -(uint)(fVar146 <= ABS(fVar251));
  uVar67 = -(uint)(fVar73 <= ABS(fVar258));
  uVar68 = -(uint)(fVar103 <= ABS(fVar259));
  uVar69 = -(uint)(fVar105 <= ABS(fVar260));
  auVar252._0_4_ = (uint)fVar251 & uVar66;
  auVar252._4_4_ = (uint)fVar258 & uVar67;
  auVar252._8_4_ = (uint)fVar259 & uVar68;
  auVar252._12_4_ = (uint)fVar260 & uVar69;
  auVar206._0_4_ = ~uVar66 & (uint)fVar146;
  auVar206._4_4_ = ~uVar67 & (uint)fVar73;
  auVar206._8_4_ = ~uVar68 & (uint)fVar103;
  auVar206._12_4_ = ~uVar69 & (uint)fVar105;
  auVar206 = auVar206 | auVar252;
  uVar66 = -(uint)(fVar146 <= ABS(fVar176));
  uVar67 = -(uint)(fVar73 <= ABS(fVar199));
  uVar68 = -(uint)(fVar103 <= ABS(fVar201));
  uVar69 = -(uint)(fVar105 <= ABS(fVar137));
  auVar193._0_4_ = (uint)fVar176 & uVar66;
  auVar193._4_4_ = (uint)fVar199 & uVar67;
  auVar193._8_4_ = (uint)fVar201 & uVar68;
  auVar193._12_4_ = (uint)fVar137 & uVar69;
  auVar215._0_4_ = ~uVar66 & (uint)fVar146;
  auVar215._4_4_ = ~uVar67 & (uint)fVar73;
  auVar215._8_4_ = ~uVar68 & (uint)fVar103;
  auVar215._12_4_ = ~uVar69 & (uint)fVar105;
  auVar215 = auVar215 | auVar193;
  auVar75 = rcpps(_DAT_01f80d30,auVar150);
  fVar146 = auVar75._0_4_;
  fVar105 = auVar75._4_4_;
  fVar162 = auVar75._8_4_;
  fVar214 = auVar75._12_4_;
  fVar146 = (1.0 - auVar150._0_4_ * fVar146) * fVar146 + fVar146;
  fVar105 = (1.0 - auVar150._4_4_ * fVar105) * fVar105 + fVar105;
  fVar162 = (1.0 - auVar150._8_4_ * fVar162) * fVar162 + fVar162;
  fVar214 = (1.0 - auVar150._12_4_ * fVar214) * fVar214 + fVar214;
  auVar75 = rcpps(auVar75,auVar206);
  fVar73 = auVar75._0_4_;
  fVar109 = auVar75._4_4_;
  fVar172 = auVar75._8_4_;
  fVar221 = auVar75._12_4_;
  fVar73 = (1.0 - auVar206._0_4_ * fVar73) * fVar73 + fVar73;
  fVar109 = (1.0 - auVar206._4_4_ * fVar109) * fVar109 + fVar109;
  fVar172 = (1.0 - auVar206._8_4_ * fVar172) * fVar172 + fVar172;
  fVar221 = (1.0 - auVar206._12_4_ * fVar221) * fVar221 + fVar221;
  auVar75 = rcpps(auVar75,auVar215);
  fVar103 = auVar75._0_4_;
  fVar132 = auVar75._4_4_;
  fVar173 = auVar75._8_4_;
  fVar222 = auVar75._12_4_;
  fVar103 = (1.0 - auVar215._0_4_ * fVar103) * fVar103 + fVar103;
  fVar132 = (1.0 - auVar215._4_4_ * fVar132) * fVar132 + fVar132;
  fVar173 = (1.0 - auVar215._8_4_ * fVar173) * fVar173 + fVar173;
  fVar222 = (1.0 - auVar215._12_4_ * fVar222) * fVar222 + fVar222;
  fVar246 = (*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar23 + 0x16)) *
            *(float *)(prim + lVar23 + 0x1a);
  uVar62 = *(ulong *)(prim + uVar54 * 7 + 6);
  uVar102 = (undefined2)(uVar62 >> 0x30);
  auVar78._8_4_ = 0;
  auVar78._0_8_ = uVar62;
  auVar78._12_2_ = uVar102;
  auVar78._14_2_ = uVar102;
  uVar102 = (undefined2)(uVar62 >> 0x20);
  auVar77._12_4_ = auVar78._12_4_;
  auVar77._8_2_ = 0;
  auVar77._0_8_ = uVar62;
  auVar77._10_2_ = uVar102;
  auVar76._10_6_ = auVar77._10_6_;
  auVar76._8_2_ = uVar102;
  auVar76._0_8_ = uVar62;
  uVar102 = (undefined2)(uVar62 >> 0x10);
  auVar36._4_8_ = auVar76._8_8_;
  auVar36._2_2_ = uVar102;
  auVar36._0_2_ = uVar102;
  fVar134 = (float)(auVar36._0_4_ >> 0x10);
  fVar176 = (float)(auVar76._8_4_ >> 0x10);
  uVar64 = *(ulong *)(prim + uVar54 * 0xb + 6);
  uVar102 = (undefined2)(uVar64 >> 0x30);
  auVar153._8_4_ = 0;
  auVar153._0_8_ = uVar64;
  auVar153._12_2_ = uVar102;
  auVar153._14_2_ = uVar102;
  uVar102 = (undefined2)(uVar64 >> 0x20);
  auVar152._12_4_ = auVar153._12_4_;
  auVar152._8_2_ = 0;
  auVar152._0_8_ = uVar64;
  auVar152._10_2_ = uVar102;
  auVar151._10_6_ = auVar152._10_6_;
  auVar151._8_2_ = uVar102;
  auVar151._0_8_ = uVar64;
  uVar102 = (undefined2)(uVar64 >> 0x10);
  auVar37._4_8_ = auVar151._8_8_;
  auVar37._2_2_ = uVar102;
  auVar37._0_2_ = uVar102;
  uVar10 = *(ulong *)(prim + uVar54 * 9 + 6);
  uVar102 = (undefined2)(uVar10 >> 0x30);
  auVar81._8_4_ = 0;
  auVar81._0_8_ = uVar10;
  auVar81._12_2_ = uVar102;
  auVar81._14_2_ = uVar102;
  uVar102 = (undefined2)(uVar10 >> 0x20);
  auVar80._12_4_ = auVar81._12_4_;
  auVar80._8_2_ = 0;
  auVar80._0_8_ = uVar10;
  auVar80._10_2_ = uVar102;
  auVar79._10_6_ = auVar80._10_6_;
  auVar79._8_2_ = uVar102;
  auVar79._0_8_ = uVar10;
  uVar102 = (undefined2)(uVar10 >> 0x10);
  auVar38._4_8_ = auVar79._8_8_;
  auVar38._2_2_ = uVar102;
  auVar38._0_2_ = uVar102;
  fVar137 = (float)(auVar38._0_4_ >> 0x10);
  fVar199 = (float)(auVar79._8_4_ >> 0x10);
  uVar11 = *(ulong *)(prim + uVar54 * 0xd + 6);
  uVar102 = (undefined2)(uVar11 >> 0x30);
  auVar218._8_4_ = 0;
  auVar218._0_8_ = uVar11;
  auVar218._12_2_ = uVar102;
  auVar218._14_2_ = uVar102;
  uVar102 = (undefined2)(uVar11 >> 0x20);
  auVar217._12_4_ = auVar218._12_4_;
  auVar217._8_2_ = 0;
  auVar217._0_8_ = uVar11;
  auVar217._10_2_ = uVar102;
  auVar216._10_6_ = auVar217._10_6_;
  auVar216._8_2_ = uVar102;
  auVar216._0_8_ = uVar11;
  uVar102 = (undefined2)(uVar11 >> 0x10);
  auVar39._4_8_ = auVar216._8_8_;
  auVar39._2_2_ = uVar102;
  auVar39._0_2_ = uVar102;
  uVar12 = *(ulong *)(prim + uVar54 * 0x12 + 6);
  uVar102 = (undefined2)(uVar12 >> 0x30);
  auVar84._8_4_ = 0;
  auVar84._0_8_ = uVar12;
  auVar84._12_2_ = uVar102;
  auVar84._14_2_ = uVar102;
  uVar102 = (undefined2)(uVar12 >> 0x20);
  auVar83._12_4_ = auVar84._12_4_;
  auVar83._8_2_ = 0;
  auVar83._0_8_ = uVar12;
  auVar83._10_2_ = uVar102;
  auVar82._10_6_ = auVar83._10_6_;
  auVar82._8_2_ = uVar102;
  auVar82._0_8_ = uVar12;
  uVar102 = (undefined2)(uVar12 >> 0x10);
  auVar40._4_8_ = auVar82._8_8_;
  auVar40._2_2_ = uVar102;
  auVar40._0_2_ = uVar102;
  fVar144 = (float)(auVar40._0_4_ >> 0x10);
  fVar201 = (float)(auVar82._8_4_ >> 0x10);
  uVar60 = (ulong)(uint)((int)(uVar54 * 5) << 2);
  uVar13 = *(ulong *)(prim + uVar54 * 2 + uVar60 + 6);
  uVar102 = (undefined2)(uVar13 >> 0x30);
  auVar231._8_4_ = 0;
  auVar231._0_8_ = uVar13;
  auVar231._12_2_ = uVar102;
  auVar231._14_2_ = uVar102;
  uVar102 = (undefined2)(uVar13 >> 0x20);
  auVar230._12_4_ = auVar231._12_4_;
  auVar230._8_2_ = 0;
  auVar230._0_8_ = uVar13;
  auVar230._10_2_ = uVar102;
  auVar229._10_6_ = auVar230._10_6_;
  auVar229._8_2_ = uVar102;
  auVar229._0_8_ = uVar13;
  uVar102 = (undefined2)(uVar13 >> 0x10);
  auVar41._4_8_ = auVar229._8_8_;
  auVar41._2_2_ = uVar102;
  auVar41._0_2_ = uVar102;
  uVar60 = *(ulong *)(prim + uVar60 + 6);
  uVar102 = (undefined2)(uVar60 >> 0x30);
  auVar87._8_4_ = 0;
  auVar87._0_8_ = uVar60;
  auVar87._12_2_ = uVar102;
  auVar87._14_2_ = uVar102;
  uVar102 = (undefined2)(uVar60 >> 0x20);
  auVar86._12_4_ = auVar87._12_4_;
  auVar86._8_2_ = 0;
  auVar86._0_8_ = uVar60;
  auVar86._10_2_ = uVar102;
  auVar85._10_6_ = auVar86._10_6_;
  auVar85._8_2_ = uVar102;
  auVar85._0_8_ = uVar60;
  uVar102 = (undefined2)(uVar60 >> 0x10);
  auVar42._4_8_ = auVar85._8_8_;
  auVar42._2_2_ = uVar102;
  auVar42._0_2_ = uVar102;
  fVar149 = (float)(auVar42._0_4_ >> 0x10);
  fVar204 = (float)(auVar85._8_4_ >> 0x10);
  uVar14 = *(ulong *)(prim + uVar54 * 0x18 + 6);
  uVar102 = (undefined2)(uVar14 >> 0x30);
  auVar241._8_4_ = 0;
  auVar241._0_8_ = uVar14;
  auVar241._12_2_ = uVar102;
  auVar241._14_2_ = uVar102;
  uVar102 = (undefined2)(uVar14 >> 0x20);
  auVar240._12_4_ = auVar241._12_4_;
  auVar240._8_2_ = 0;
  auVar240._0_8_ = uVar14;
  auVar240._10_2_ = uVar102;
  auVar239._10_6_ = auVar240._10_6_;
  auVar239._8_2_ = uVar102;
  auVar239._0_8_ = uVar14;
  uVar102 = (undefined2)(uVar14 >> 0x10);
  auVar43._4_8_ = auVar239._8_8_;
  auVar43._2_2_ = uVar102;
  auVar43._0_2_ = uVar102;
  uVar15 = *(ulong *)(prim + uVar54 * 0x1d + 6);
  uVar102 = (undefined2)(uVar15 >> 0x30);
  auVar90._8_4_ = 0;
  auVar90._0_8_ = uVar15;
  auVar90._12_2_ = uVar102;
  auVar90._14_2_ = uVar102;
  uVar102 = (undefined2)(uVar15 >> 0x20);
  auVar89._12_4_ = auVar90._12_4_;
  auVar89._8_2_ = 0;
  auVar89._0_8_ = uVar15;
  auVar89._10_2_ = uVar102;
  auVar88._10_6_ = auVar89._10_6_;
  auVar88._8_2_ = uVar102;
  auVar88._0_8_ = uVar15;
  uVar102 = (undefined2)(uVar15 >> 0x10);
  auVar44._4_8_ = auVar88._8_8_;
  auVar44._2_2_ = uVar102;
  auVar44._0_2_ = uVar102;
  fVar160 = (float)(auVar44._0_4_ >> 0x10);
  fVar209 = (float)(auVar88._8_4_ >> 0x10);
  uVar16 = *(ulong *)(prim + uVar54 + (ulong)(byte)PVar18 * 0x20 + 6);
  uVar102 = (undefined2)(uVar16 >> 0x30);
  auVar255._8_4_ = 0;
  auVar255._0_8_ = uVar16;
  auVar255._12_2_ = uVar102;
  auVar255._14_2_ = uVar102;
  uVar102 = (undefined2)(uVar16 >> 0x20);
  auVar254._12_4_ = auVar255._12_4_;
  auVar254._8_2_ = 0;
  auVar254._0_8_ = uVar16;
  auVar254._10_2_ = uVar102;
  auVar253._10_6_ = auVar254._10_6_;
  auVar253._8_2_ = uVar102;
  auVar253._0_8_ = uVar16;
  uVar102 = (undefined2)(uVar16 >> 0x10);
  auVar45._4_8_ = auVar253._8_8_;
  auVar45._2_2_ = uVar102;
  auVar45._0_2_ = uVar102;
  uVar17 = *(ulong *)(prim + ((ulong)(byte)PVar18 * 0x20 - uVar54) + 6);
  uVar102 = (undefined2)(uVar17 >> 0x30);
  auVar93._8_4_ = 0;
  auVar93._0_8_ = uVar17;
  auVar93._12_2_ = uVar102;
  auVar93._14_2_ = uVar102;
  uVar102 = (undefined2)(uVar17 >> 0x20);
  auVar92._12_4_ = auVar93._12_4_;
  auVar92._8_2_ = 0;
  auVar92._0_8_ = uVar17;
  auVar92._10_2_ = uVar102;
  auVar91._10_6_ = auVar92._10_6_;
  auVar91._8_2_ = uVar102;
  auVar91._0_8_ = uVar17;
  uVar102 = (undefined2)(uVar17 >> 0x10);
  auVar46._4_8_ = auVar91._8_8_;
  auVar46._2_2_ = uVar102;
  auVar46._0_2_ = uVar102;
  fVar161 = (float)(auVar46._0_4_ >> 0x10);
  fVar211 = (float)(auVar91._8_4_ >> 0x10);
  uVar54 = *(ulong *)(prim + uVar54 * 0x23 + 6);
  uVar102 = (undefined2)(uVar54 >> 0x30);
  auVar265._8_4_ = 0;
  auVar265._0_8_ = uVar54;
  auVar265._12_2_ = uVar102;
  auVar265._14_2_ = uVar102;
  uVar102 = (undefined2)(uVar54 >> 0x20);
  auVar264._12_4_ = auVar265._12_4_;
  auVar264._8_2_ = 0;
  auVar264._0_8_ = uVar54;
  auVar264._10_2_ = uVar102;
  auVar263._10_6_ = auVar264._10_6_;
  auVar263._8_2_ = uVar102;
  auVar263._0_8_ = uVar54;
  uVar102 = (undefined2)(uVar54 >> 0x10);
  auVar47._4_8_ = auVar263._8_8_;
  auVar47._2_2_ = uVar102;
  auVar47._0_2_ = uVar102;
  auVar154._0_8_ =
       CONCAT44(((((float)(auVar37._0_4_ >> 0x10) - fVar134) * fVar246 + fVar134) - fVar282) *
                fVar105,((((float)(int)(short)uVar64 - (float)(int)(short)uVar62) * fVar246 +
                         (float)(int)(short)uVar62) - fVar276) * fVar146);
  auVar154._8_4_ =
       ((((float)(auVar151._8_4_ >> 0x10) - fVar176) * fVar246 + fVar176) - fVar283) * fVar162;
  auVar154._12_4_ =
       ((((float)(auVar152._12_4_ >> 0x10) - (float)(auVar77._12_4_ >> 0x10)) * fVar246 +
        (float)(auVar77._12_4_ >> 0x10)) - fVar284) * fVar214;
  auVar219._0_4_ =
       ((((float)(int)(short)uVar11 - (float)(int)(short)uVar10) * fVar246 +
        (float)(int)(short)uVar10) - fVar276) * fVar146;
  auVar219._4_4_ =
       ((((float)(auVar39._0_4_ >> 0x10) - fVar137) * fVar246 + fVar137) - fVar282) * fVar105;
  auVar219._8_4_ =
       ((((float)(auVar216._8_4_ >> 0x10) - fVar199) * fVar246 + fVar199) - fVar283) * fVar162;
  auVar219._12_4_ =
       ((((float)(auVar217._12_4_ >> 0x10) - (float)(auVar80._12_4_ >> 0x10)) * fVar246 +
        (float)(auVar80._12_4_ >> 0x10)) - fVar284) * fVar214;
  auVar232._0_8_ =
       CONCAT44(((((float)(auVar41._0_4_ >> 0x10) - fVar144) * fVar246 + fVar144) - fVar235) *
                fVar109,((((float)(int)(short)uVar13 - (float)(int)(short)uVar12) * fVar246 +
                         (float)(int)(short)uVar12) - fVar228) * fVar73);
  auVar232._8_4_ =
       ((((float)(auVar229._8_4_ >> 0x10) - fVar201) * fVar246 + fVar201) - fVar236) * fVar172;
  auVar232._12_4_ =
       ((((float)(auVar230._12_4_ >> 0x10) - (float)(auVar83._12_4_ >> 0x10)) * fVar246 +
        (float)(auVar83._12_4_ >> 0x10)) - fVar275) * fVar221;
  auVar242._0_4_ =
       ((((float)(int)(short)uVar14 - (float)(int)(short)uVar60) * fVar246 +
        (float)(int)(short)uVar60) - fVar228) * fVar73;
  auVar242._4_4_ =
       ((((float)(auVar43._0_4_ >> 0x10) - fVar149) * fVar246 + fVar149) - fVar235) * fVar109;
  auVar242._8_4_ =
       ((((float)(auVar239._8_4_ >> 0x10) - fVar204) * fVar246 + fVar204) - fVar236) * fVar172;
  auVar242._12_4_ =
       ((((float)(auVar240._12_4_ >> 0x10) - (float)(auVar86._12_4_ >> 0x10)) * fVar246 +
        (float)(auVar86._12_4_ >> 0x10)) - fVar275) * fVar221;
  uVar57 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar256._0_8_ =
       CONCAT44(((((float)(auVar45._0_4_ >> 0x10) - fVar160) * fVar246 + fVar160) - fVar226) *
                fVar132,((((float)(int)(short)uVar16 - (float)(int)(short)uVar15) * fVar246 +
                         (float)(int)(short)uVar15) - fVar223) * fVar103);
  auVar256._8_4_ =
       ((((float)(auVar253._8_4_ >> 0x10) - fVar209) * fVar246 + fVar209) - fVar227) * fVar173;
  auVar256._12_4_ =
       ((((float)(auVar254._12_4_ >> 0x10) - (float)(auVar89._12_4_ >> 0x10)) * fVar246 +
        (float)(auVar89._12_4_ >> 0x10)) - fVar237) * fVar222;
  auVar266._0_4_ =
       ((((float)(int)(short)uVar54 - (float)(int)(short)uVar17) * fVar246 +
        (float)(int)(short)uVar17) - fVar223) * fVar103;
  auVar266._4_4_ =
       ((((float)(auVar47._0_4_ >> 0x10) - fVar161) * fVar246 + fVar161) - fVar226) * fVar132;
  auVar266._8_4_ =
       ((((float)(auVar263._8_4_ >> 0x10) - fVar211) * fVar246 + fVar211) - fVar227) * fVar173;
  auVar266._12_4_ =
       ((((float)(auVar264._12_4_ >> 0x10) - (float)(auVar92._12_4_ >> 0x10)) * fVar246 +
        (float)(auVar92._12_4_ >> 0x10)) - fVar237) * fVar222;
  auVar139._8_4_ = auVar154._8_4_;
  auVar139._0_8_ = auVar154._0_8_;
  auVar139._12_4_ = auVar154._12_4_;
  auVar140 = minps(auVar139,auVar219);
  auVar120._8_4_ = auVar232._8_4_;
  auVar120._0_8_ = auVar232._0_8_;
  auVar120._12_4_ = auVar232._12_4_;
  auVar75 = minps(auVar120,auVar242);
  auVar140 = maxps(auVar140,auVar75);
  auVar121._8_4_ = auVar256._8_4_;
  auVar121._0_8_ = auVar256._0_8_;
  auVar121._12_4_ = auVar256._12_4_;
  auVar75 = minps(auVar121,auVar266);
  auVar94._4_4_ = uVar57;
  auVar94._0_4_ = uVar57;
  auVar94._8_4_ = uVar57;
  auVar94._12_4_ = uVar57;
  auVar75 = maxps(auVar75,auVar94);
  auVar75 = maxps(auVar140,auVar75);
  auVar140 = maxps(auVar154,auVar219);
  auVar233 = maxps(auVar232,auVar242);
  auVar140 = minps(auVar140,auVar233);
  local_48 = auVar75._0_4_ * 0.99999964;
  fStack_44 = auVar75._4_4_ * 0.99999964;
  fStack_40 = auVar75._8_4_ * 0.99999964;
  fStack_3c = auVar75._12_4_ * 0.99999964;
  auVar75 = maxps(auVar256,auVar266);
  uVar57 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar95._4_4_ = uVar57;
  auVar95._0_4_ = uVar57;
  auVar95._8_4_ = uVar57;
  auVar95._12_4_ = uVar57;
  auVar75 = minps(auVar75,auVar95);
  auVar75 = minps(auVar140,auVar75);
  uVar66 = (uint)(byte)PVar18;
  auVar122._0_4_ = -(uint)(uVar66 != 0 && local_48 <= auVar75._0_4_ * 1.0000004);
  auVar122._4_4_ = -(uint)(1 < uVar66 && fStack_44 <= auVar75._4_4_ * 1.0000004);
  auVar122._8_4_ = -(uint)(2 < uVar66 && fStack_40 <= auVar75._8_4_ * 1.0000004);
  auVar122._12_4_ = -(uint)(3 < uVar66 && fStack_3c <= auVar75._12_4_ * 1.0000004);
  uVar66 = movmskps(uVar66,auVar122);
  if (uVar66 != 0) {
    uVar66 = uVar66 & 0xff;
    local_238 = pre->ray_space + k;
    local_3a8 = mm_lookupmask_ps._0_8_;
    uStack_3a0 = mm_lookupmask_ps._8_8_;
    local_348 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
    local_340 = pre;
    local_230 = prim;
    do {
      lVar23 = 0;
      if (uVar66 != 0) {
        for (; (uVar66 >> lVar23 & 1) == 0; lVar23 = lVar23 + 1) {
        }
      }
      local_3b0 = (ulong)*(uint *)(local_230 + 2);
      local_2f8 = (ulong)*(uint *)(local_230 + lVar23 * 4 + 6);
      pGVar20 = (context->scene->geometries).items[local_3b0].ptr;
      uVar62 = (ulong)*(uint *)(*(long *)&pGVar20->field_0x58 +
                               local_2f8 *
                               pGVar20[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i);
      fVar146 = pGVar20->fnumTimeSegments;
      fVar73 = (pGVar20->time_range).lower;
      fVar103 = ((*(float *)(ray + k * 4 + 0x70) - fVar73) / ((pGVar20->time_range).upper - fVar73))
                * fVar146;
      fVar73 = floorf(fVar103);
      fVar146 = fVar146 + -1.0;
      if (fVar146 <= fVar73) {
        fVar73 = fVar146;
      }
      fVar146 = 0.0;
      if (0.0 <= fVar73) {
        fVar146 = fVar73;
      }
      _Var21 = pGVar20[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      pGVar61 = (Geometry *)((long)(int)fVar146 * 0x38);
      lVar23 = *(long *)((long)&pGVar61->device + _Var21);
      lVar65 = *(long *)((long)&pGVar61->modCounter_ + _Var21);
      lVar22 = *(long *)((long)&pGVar61->occlusionFilterN + _Var21);
      pfVar1 = (float *)(lVar65 + uVar62 * lVar22);
      pfVar2 = (float *)(lVar65 + (uVar62 + 1) * lVar22);
      pfVar3 = (float *)(lVar65 + (uVar62 + 2) * lVar22);
      fVar103 = fVar103 - fVar146;
      fVar146 = 1.0 - fVar103;
      pfVar4 = (float *)(lVar65 + lVar22 * (uVar62 + 3));
      lVar65 = *(long *)((long)&(pGVar61->super_RefCount)._vptr_RefCount + _Var21);
      pfVar5 = (float *)(lVar65 + lVar23 * uVar62);
      pfVar6 = (float *)(lVar65 + lVar23 * (uVar62 + 1));
      local_2c8 = *pfVar5 * fVar146 + *pfVar1 * fVar103;
      fStack_2c4 = pfVar5[1] * fVar146 + pfVar1[1] * fVar103;
      fStack_2c0 = pfVar5[2] * fVar146 + pfVar1[2] * fVar103;
      fStack_2bc = pfVar5[3] * fVar146 + pfVar1[3] * fVar103;
      local_2d8 = *pfVar6 * fVar146 + *pfVar2 * fVar103;
      fStack_2d4 = pfVar6[1] * fVar146 + pfVar2[1] * fVar103;
      fStack_2d0 = pfVar6[2] * fVar146 + pfVar2[2] * fVar103;
      fStack_2cc = pfVar6[3] * fVar146 + pfVar2[3] * fVar103;
      pfVar1 = (float *)(lVar65 + lVar23 * (uVar62 + 2));
      local_2e8 = *pfVar1 * fVar146 + *pfVar3 * fVar103;
      fStack_2e4 = pfVar1[1] * fVar146 + pfVar3[1] * fVar103;
      fStack_2e0 = pfVar1[2] * fVar146 + pfVar3[2] * fVar103;
      fStack_2dc = pfVar1[3] * fVar146 + pfVar3[3] * fVar103;
      pfVar1 = (float *)(lVar65 + lVar23 * (uVar62 + 3));
      local_2b8 = fVar146 * *pfVar1 + fVar103 * *pfVar4;
      fStack_2b4 = fVar146 * pfVar1[1] + fVar103 * pfVar4[1];
      fStack_2b0 = fVar146 * pfVar1[2] + fVar103 * pfVar4[2];
      fStack_2ac = fVar146 * pfVar1[3] + fVar103 * pfVar4[3];
      iVar19 = (int)pGVar20[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      fVar146 = *(float *)(ray + k * 4);
      fVar73 = *(float *)(ray + k * 4 + 0x10);
      fVar103 = *(float *)(ray + k * 4 + 0x20);
      fVar162 = local_2c8 - fVar146;
      fVar172 = fStack_2c4 - fVar73;
      fVar173 = fStack_2c0 - fVar103;
      fVar105 = (local_238->vx).field_0.m128[0];
      fVar109 = (local_238->vx).field_0.m128[1];
      fVar132 = (local_238->vx).field_0.m128[2];
      fVar134 = (local_238->vy).field_0.m128[0];
      fVar137 = (local_238->vy).field_0.m128[1];
      fVar144 = (local_238->vy).field_0.m128[2];
      fVar149 = (local_238->vz).field_0.m128[0];
      fVar160 = (local_238->vz).field_0.m128[1];
      fVar161 = (local_238->vz).field_0.m128[2];
      local_1d8 = fVar162 * fVar105 + fVar172 * fVar134 + fVar173 * fVar149;
      local_1e8 = fVar162 * fVar109 + fVar172 * fVar137 + fVar173 * fVar160;
      fVar176 = fVar162 * fVar132 + fVar172 * fVar144 + fVar173 * fVar161;
      fVar162 = local_2d8 - fVar146;
      fVar172 = fStack_2d4 - fVar73;
      fVar173 = fStack_2d0 - fVar103;
      local_398 = fVar162 * fVar105 + fVar172 * fVar134 + fVar173 * fVar149;
      local_378 = fVar162 * fVar109 + fVar172 * fVar137 + fVar173 * fVar160;
      fVar199 = fVar162 * fVar132 + fVar172 * fVar144 + fVar173 * fVar161;
      fVar162 = local_2e8 - fVar146;
      fVar172 = fStack_2e4 - fVar73;
      fVar173 = fStack_2e0 - fVar103;
      local_358 = fVar162 * fVar105 + fVar172 * fVar134 + fVar173 * fVar149;
      fVar201 = fVar162 * fVar109 + fVar172 * fVar137 + fVar173 * fVar160;
      local_298 = fVar162 * fVar132 + fVar172 * fVar144 + fVar173 * fVar161;
      fVar146 = local_2b8 - fVar146;
      fVar73 = fStack_2b4 - fVar73;
      fVar103 = fStack_2b0 - fVar103;
      fVar105 = fVar146 * fVar105 + fVar73 * fVar134 + fVar103 * fVar149;
      fVar109 = fVar146 * fVar109 + fVar73 * fVar137 + fVar103 * fVar160;
      local_368 = fVar146 * fVar132 + fVar73 * fVar144 + fVar103 * fVar161;
      auVar243._0_8_ = CONCAT44(local_1e8,local_1d8) & 0x7fffffff7fffffff;
      auVar243._8_4_ = ABS(fVar176);
      auVar243._12_4_ = ABS(fStack_2bc);
      auVar163._0_8_ = CONCAT44(local_378,local_398) & 0x7fffffff7fffffff;
      auVar163._8_4_ = ABS(fVar199);
      auVar163._12_4_ = ABS(fStack_2cc);
      auVar140 = maxps(auVar243,auVar163);
      auVar194._0_8_ = CONCAT44(fVar201,local_358) & 0x7fffffff7fffffff;
      auVar194._8_4_ = ABS(local_298);
      auVar194._12_4_ = ABS(fStack_2dc);
      auVar123._0_8_ = CONCAT44(fVar109,fVar105) & 0x7fffffff7fffffff;
      auVar123._8_4_ = ABS(local_368);
      auVar123._12_4_ = ABS(fStack_2ac);
      auVar75 = maxps(auVar194,auVar123);
      auVar75 = maxps(auVar140,auVar75);
      uVar107 = auVar75._8_8_;
      fVar146 = auVar75._4_4_;
      if (auVar75._4_4_ <= auVar75._0_4_) {
        fVar146 = auVar75._0_4_;
      }
      auVar244._8_8_ = uVar107;
      auVar244._0_8_ = uVar107;
      fVar73 = (float)iVar19;
      local_308 = ZEXT416((uint)fVar73);
      if (auVar75._8_4_ <= fVar146) {
        auVar245._4_12_ = auVar244._4_12_;
        auVar245._0_4_ = fVar146;
        uVar107 = auVar245._0_8_;
      }
      pRVar58 = (RTCIntersectArguments *)((long)iVar19 * 0x40);
      lVar23 = (long)iVar19 * 0x44;
      pauVar8 = (undefined1 (*) [16])(catmullrom_basis0 + lVar23 + 0x908);
      fVar146 = *(float *)*pauVar8;
      fVar103 = *(float *)(catmullrom_basis0 + lVar23 + 0x90c);
      fVar132 = *(float *)(catmullrom_basis0 + lVar23 + 0x910);
      auVar27 = *(undefined1 (*) [12])*pauVar8;
      fVar134 = *(float *)(catmullrom_basis0 + lVar23 + 0x914);
      fVar137 = *(float *)(catmullrom_basis0 + lVar23 + 0xd8c);
      fVar144 = *(float *)(catmullrom_basis0 + lVar23 + 0xd90);
      fVar149 = *(float *)(catmullrom_basis0 + lVar23 + 0xd94);
      fVar160 = *(float *)(catmullrom_basis0 + lVar23 + 0xd98);
      fVar161 = *(float *)(catmullrom_basis0 + lVar23 + 0x484);
      fVar162 = *(float *)(catmullrom_basis0 + lVar23 + 0x488);
      fVar172 = *(float *)(catmullrom_basis0 + lVar23 + 0x48c);
      fVar173 = *(float *)(catmullrom_basis0 + lVar23 + 0x490);
      fVar204 = *(float *)(catmullrom_basis0 + lVar23);
      fVar209 = *(float *)(catmullrom_basis0 + lVar23 + 4);
      fVar211 = *(float *)(catmullrom_basis0 + lVar23 + 8);
      fVar214 = *(float *)(catmullrom_basis0 + lVar23 + 0xc);
      local_248 = local_1d8 * fVar204 +
                  local_398 * fVar161 + local_358 * fVar146 + fVar105 * fVar137;
      fStack_244 = local_1d8 * fVar209 +
                   local_398 * fVar162 + local_358 * fVar103 + fVar105 * fVar144;
      fStack_240 = local_1d8 * fVar211 +
                   local_398 * fVar172 + local_358 * fVar132 + fVar105 * fVar149;
      fStack_23c = local_1d8 * fVar214 +
                   local_398 * fVar173 + local_358 * fVar134 + fVar105 * fVar160;
      local_258 = local_1e8 * fVar204 + local_378 * fVar161 + fVar201 * fVar146 + fVar109 * fVar137;
      fStack_254 = local_1e8 * fVar209 + local_378 * fVar162 + fVar201 * fVar103 + fVar109 * fVar144
      ;
      fStack_250 = local_1e8 * fVar211 + local_378 * fVar172 + fVar201 * fVar132 + fVar109 * fVar149
      ;
      fStack_24c = local_1e8 * fVar214 + local_378 * fVar173 + fVar201 * fVar134 + fVar109 * fVar160
      ;
      fVar269 = fStack_2bc * fVar204 +
                fStack_2cc * fVar161 + fStack_2dc * fVar146 + fStack_2ac * fVar137;
      fVar271 = fStack_2bc * fVar209 +
                fStack_2cc * fVar162 + fStack_2dc * fVar103 + fStack_2ac * fVar144;
      auVar224._4_4_ = fVar271;
      auVar224._0_4_ = fVar269;
      fVar273 = fStack_2bc * fVar211 +
                fStack_2cc * fVar172 + fStack_2dc * fVar132 + fStack_2ac * fVar149;
      fVar276 = fStack_2bc * fVar214 +
                fStack_2cc * fVar173 + fStack_2dc * fVar134 + fStack_2ac * fVar160;
      fVar103 = *(float *)(catmullrom_basis1 + lVar23 + 0xd8c);
      fVar132 = *(float *)(catmullrom_basis1 + lVar23 + 0xd90);
      fVar221 = *(float *)(catmullrom_basis1 + lVar23 + 0xd94);
      fVar222 = *(float *)(catmullrom_basis1 + lVar23 + 0xd98);
      pauVar9 = (undefined1 (*) [16])(catmullrom_basis1 + lVar23 + 0x908);
      fVar146 = *(float *)*pauVar9;
      fVar228 = *(float *)(catmullrom_basis1 + lVar23 + 0x90c);
      fVar235 = *(float *)(catmullrom_basis1 + lVar23 + 0x910);
      auVar28 = *(undefined1 (*) [12])*pauVar9;
      fVar236 = *(float *)(catmullrom_basis1 + lVar23 + 0x914);
      _local_268 = *pauVar9;
      fVar275 = *(float *)(catmullrom_basis1 + lVar23 + 0x484);
      fVar223 = *(float *)(catmullrom_basis1 + lVar23 + 0x488);
      fVar226 = *(float *)(catmullrom_basis1 + lVar23 + 0x48c);
      fVar227 = *(float *)(catmullrom_basis1 + lVar23 + 0x490);
      fVar237 = *(float *)(catmullrom_basis1 + lVar23);
      fVar246 = *(float *)(catmullrom_basis1 + lVar23 + 4);
      fVar248 = *(float *)(catmullrom_basis1 + lVar23 + 8);
      fVar251 = *(float *)(catmullrom_basis1 + lVar23 + 0xc);
      fVar205 = local_1d8 * fVar237 + local_398 * fVar275 + local_358 * fVar146 + fVar105 * fVar103;
      fVar210 = local_1d8 * fVar246 + local_398 * fVar223 + local_358 * fVar228 + fVar105 * fVar132;
      fVar212 = local_1d8 * fVar248 + local_398 * fVar226 + local_358 * fVar235 + fVar105 * fVar221;
      fVar213 = local_1d8 * fVar251 + local_398 * fVar227 + local_358 * fVar236 + fVar105 * fVar222;
      fVar258 = local_1e8 * fVar237 + local_378 * fVar275 + fVar201 * fVar146 + fVar109 * fVar103;
      fVar259 = local_1e8 * fVar246 + local_378 * fVar223 + fVar201 * fVar228 + fVar109 * fVar132;
      fVar260 = local_1e8 * fVar248 + local_378 * fVar226 + fVar201 * fVar235 + fVar109 * fVar221;
      fVar261 = local_1e8 * fVar251 + local_378 * fVar227 + fVar201 * fVar236 + fVar109 * fVar222;
      fVar292 = fStack_2bc * fVar237 +
                fStack_2cc * fVar275 + fStack_2dc * fVar146 + fStack_2ac * fVar103;
      fVar294 = fStack_2bc * fVar246 +
                fStack_2cc * fVar223 + fStack_2dc * fVar228 + fStack_2ac * fVar132;
      fVar296 = fStack_2bc * fVar248 +
                fStack_2cc * fVar226 + fStack_2dc * fVar235 + fStack_2ac * fVar221;
      fVar298 = fStack_2bc * fVar251 +
                fStack_2cc * fVar227 + fStack_2dc * fVar236 + fStack_2ac * fVar222;
      fVar177 = fVar205 - local_248;
      fVar200 = fVar210 - fStack_244;
      fVar202 = fVar212 - fStack_240;
      fVar203 = fVar213 - fStack_23c;
      fVar283 = fVar258 - local_258;
      fVar284 = fVar259 - fStack_254;
      fVar174 = fVar260 - fStack_250;
      fVar175 = fVar261 - fStack_24c;
      fVar146 = local_258 * fVar177 - local_248 * fVar283;
      fVar228 = fStack_254 * fVar200 - fStack_244 * fVar284;
      fVar235 = fStack_250 * fVar202 - fStack_240 * fVar174;
      fVar282 = fStack_24c * fVar203 - fStack_23c * fVar175;
      auVar224._8_4_ = fVar273;
      auVar224._12_4_ = fVar276;
      auVar24._4_4_ = fVar294;
      auVar24._0_4_ = fVar292;
      auVar24._8_4_ = fVar296;
      auVar24._12_4_ = fVar298;
      auVar75 = maxps(auVar224,auVar24);
      bVar49 = fVar146 * fVar146 <=
               auVar75._0_4_ * auVar75._0_4_ * (fVar177 * fVar177 + fVar283 * fVar283) &&
               0.0 < fVar73;
      auVar155._0_4_ = -(uint)bVar49;
      bVar50 = fVar228 * fVar228 <=
               auVar75._4_4_ * auVar75._4_4_ * (fVar200 * fVar200 + fVar284 * fVar284) &&
               1.0 < fVar73;
      auVar155._4_4_ = -(uint)bVar50;
      bVar48 = fVar235 * fVar235 <=
               auVar75._8_4_ * auVar75._8_4_ * (fVar202 * fVar202 + fVar174 * fVar174) &&
               2.0 < fVar73;
      auVar155._8_4_ = -(uint)bVar48;
      bVar63 = fVar282 * fVar282 <=
               auVar75._12_4_ * auVar75._12_4_ * (fVar203 * fVar203 + fVar175 * fVar175) &&
               3.0 < fVar73;
      auVar155._12_4_ = -(uint)bVar63;
      local_448 = (float)uVar107;
      local_448 = local_448 * 4.7683716e-07;
      iVar53 = movmskps(iVar19,auVar155);
      fVar146 = *(float *)(ray + k * 4 + 0x30);
      _local_2a8 = ZEXT416((uint)fVar146);
      _local_388 = *pauVar8;
      fStack_394 = local_398;
      fStack_390 = local_398;
      fStack_38c = local_398;
      fStack_374 = local_378;
      fStack_370 = local_378;
      fStack_36c = local_378;
      fStack_364 = local_368;
      fStack_360 = local_368;
      fStack_35c = local_368;
      fStack_354 = local_358;
      fStack_350 = local_358;
      fStack_34c = local_358;
      fStack_294 = local_298;
      fStack_290 = local_298;
      fStack_28c = local_298;
      local_228 = fStack_2bc;
      fStack_224 = fStack_2bc;
      fStack_220 = fStack_2bc;
      fStack_21c = fStack_2bc;
      local_218 = fStack_2cc;
      fStack_214 = fStack_2cc;
      fStack_210 = fStack_2cc;
      fStack_20c = fStack_2cc;
      local_208 = fStack_2ac;
      fStack_204 = fStack_2ac;
      fStack_200 = fStack_2ac;
      fStack_1fc = fStack_2ac;
      local_1f8 = fStack_2dc;
      fStack_1f4 = fStack_2dc;
      fStack_1f0 = fStack_2dc;
      fStack_1ec = fStack_2dc;
      fStack_1e4 = local_1e8;
      fStack_1e0 = local_1e8;
      fStack_1dc = local_1e8;
      fStack_1d4 = local_1d8;
      fStack_1d0 = local_1d8;
      fStack_1cc = local_1d8;
      if (iVar53 == 0) {
LAB_00b4d2a4:
        bVar63 = false;
      }
      else {
        local_268._0_4_ = auVar28._0_4_;
        local_268._4_4_ = auVar28._4_4_;
        fStack_260 = auVar28._8_4_;
        fVar138 = fVar103 * local_368 + (float)local_268._0_4_ * local_298 + fVar275 * fVar199 +
                  fVar237 * fVar176;
        fVar145 = fVar132 * local_368 + (float)local_268._4_4_ * local_298 + fVar223 * fVar199 +
                  fVar246 * fVar176;
        fVar147 = fVar221 * local_368 + fStack_260 * local_298 + fVar226 * fVar199 +
                  fVar248 * fVar176;
        fVar148 = fVar222 * local_368 + fVar236 * local_298 + fVar227 * fVar199 + fVar251 * fVar176;
        local_388._0_4_ = auVar27._0_4_;
        local_388._4_4_ = auVar27._4_4_;
        fStack_380 = auVar27._8_4_;
        fVar74 = fVar137 * local_368 + (float)local_388._0_4_ * local_298 + fVar161 * fVar199 +
                 fVar204 * fVar176;
        fVar104 = fVar144 * local_368 + (float)local_388._4_4_ * local_298 + fVar162 * fVar199 +
                  fVar209 * fVar176;
        fVar106 = fVar149 * local_368 + fStack_380 * local_298 + fVar172 * fVar199 +
                  fVar211 * fVar176;
        fVar108 = fVar160 * local_368 + fVar134 * local_298 + fVar173 * fVar199 + fVar214 * fVar176;
        fVar103 = *(float *)(catmullrom_basis0 + lVar23 + 0x1210);
        fVar132 = *(float *)(catmullrom_basis0 + lVar23 + 0x1214);
        fVar134 = *(float *)(catmullrom_basis0 + lVar23 + 0x1218);
        fVar137 = *(float *)(catmullrom_basis0 + lVar23 + 0x121c);
        fVar144 = *(float *)(catmullrom_basis0 + lVar23 + 0x1694);
        fVar149 = *(float *)(catmullrom_basis0 + lVar23 + 0x1698);
        fVar160 = *(float *)(catmullrom_basis0 + lVar23 + 0x169c);
        fVar161 = *(float *)(catmullrom_basis0 + lVar23 + 0x16a0);
        fVar162 = *(float *)(catmullrom_basis0 + lVar23 + 0x1b18);
        fVar172 = *(float *)(catmullrom_basis0 + lVar23 + 0x1b1c);
        fVar173 = *(float *)(catmullrom_basis0 + lVar23 + 0x1b20);
        fVar204 = *(float *)(catmullrom_basis0 + lVar23 + 0x1b24);
        fVar209 = *(float *)(catmullrom_basis0 + lVar23 + 0x1f9c);
        fVar211 = *(float *)(catmullrom_basis0 + lVar23 + 0x1fa0);
        fVar214 = *(float *)(catmullrom_basis0 + lVar23 + 0x1fa4);
        fVar221 = *(float *)(catmullrom_basis0 + lVar23 + 0x1fa8);
        auVar25._4_4_ = local_1d8;
        auVar25._0_4_ = local_1d8;
        auVar25._8_4_ = local_1d8;
        auVar25._12_4_ = local_1d8;
        fVar238 = local_1d8 * fVar103 +
                  local_398 * fVar144 + local_358 * fVar162 + fVar105 * fVar209;
        fVar247 = local_1d8 * fVar132 +
                  local_398 * fVar149 + local_358 * fVar172 + fVar105 * fVar211;
        fVar249 = local_1d8 * fVar134 +
                  local_398 * fVar160 + local_358 * fVar173 + fVar105 * fVar214;
        fVar250 = local_1d8 * fVar137 +
                  local_398 * fVar161 + local_358 * fVar204 + fVar105 * fVar221;
        fVar293 = local_1e8 * fVar103 + local_378 * fVar144 + fVar201 * fVar162 + fVar109 * fVar209;
        fVar295 = local_1e8 * fVar132 + local_378 * fVar149 + fVar201 * fVar172 + fVar109 * fVar211;
        fVar297 = local_1e8 * fVar134 + local_378 * fVar160 + fVar201 * fVar173 + fVar109 * fVar214;
        fVar299 = local_1e8 * fVar137 + local_378 * fVar161 + fVar201 * fVar204 + fVar109 * fVar221;
        fVar222 = *(float *)(catmullrom_basis1 + lVar23 + 0x1210);
        fVar228 = *(float *)(catmullrom_basis1 + lVar23 + 0x1214);
        fVar235 = *(float *)(catmullrom_basis1 + lVar23 + 0x1218);
        fVar236 = *(float *)(catmullrom_basis1 + lVar23 + 0x121c);
        fVar275 = *(float *)(catmullrom_basis1 + lVar23 + 0x1b18);
        fVar223 = *(float *)(catmullrom_basis1 + lVar23 + 0x1b1c);
        fVar226 = *(float *)(catmullrom_basis1 + lVar23 + 0x1b20);
        fVar227 = *(float *)(catmullrom_basis1 + lVar23 + 0x1b24);
        fVar237 = *(float *)(catmullrom_basis1 + lVar23 + 0x1f9c);
        fVar246 = *(float *)(catmullrom_basis1 + lVar23 + 0x1fa0);
        fVar248 = *(float *)(catmullrom_basis1 + lVar23 + 0x1fa4);
        fVar251 = *(float *)(catmullrom_basis1 + lVar23 + 0x1fa8);
        fVar282 = *(float *)(catmullrom_basis1 + lVar23 + 0x1694);
        fVar270 = *(float *)(catmullrom_basis1 + lVar23 + 0x1698);
        fVar272 = *(float *)(catmullrom_basis1 + lVar23 + 0x169c);
        fVar274 = *(float *)(catmullrom_basis1 + lVar23 + 0x16a0);
        fVar285 = local_1d8 * fVar222 +
                  local_398 * fVar282 + local_358 * fVar275 + fVar105 * fVar237;
        fVar289 = local_1d8 * fVar228 +
                  local_398 * fVar270 + local_358 * fVar223 + fVar105 * fVar246;
        fVar290 = local_1d8 * fVar235 +
                  local_398 * fVar272 + local_358 * fVar226 + fVar105 * fVar248;
        fVar291 = local_1d8 * fVar236 +
                  local_398 * fVar274 + local_358 * fVar227 + fVar105 * fVar251;
        fVar110 = local_1e8 * fVar222 + local_378 * fVar282 + fVar201 * fVar275 + fVar109 * fVar237;
        fVar133 = local_1e8 * fVar228 + local_378 * fVar270 + fVar201 * fVar223 + fVar109 * fVar246;
        fVar135 = local_1e8 * fVar235 + local_378 * fVar272 + fVar201 * fVar226 + fVar109 * fVar248;
        fVar136 = local_1e8 * fVar236 + local_378 * fVar274 + fVar201 * fVar227 + fVar109 * fVar251;
        auVar267._0_8_ = CONCAT44(fVar247,fVar238) & 0x7fffffff7fffffff;
        auVar267._8_4_ = ABS(fVar249);
        auVar267._12_4_ = ABS(fVar250);
        auVar225._0_8_ = CONCAT44(fVar295,fVar293) & 0x7fffffff7fffffff;
        auVar225._8_4_ = ABS(fVar297);
        auVar225._12_4_ = ABS(fVar299);
        auVar75 = maxps(auVar267,auVar225);
        auVar277._0_8_ =
             CONCAT44(fVar132 * fVar176 +
                      fVar149 * fVar199 + fVar172 * local_298 + fVar211 * local_368,
                      fVar103 * fVar176 +
                      fVar144 * fVar199 + fVar162 * local_298 + fVar209 * local_368) &
             0x7fffffff7fffffff;
        auVar277._8_4_ =
             ABS(fVar134 * fVar176 + fVar160 * fVar199 + fVar173 * local_298 + fVar214 * local_368);
        auVar277._12_4_ =
             ABS(fVar137 * fVar176 + fVar161 * fVar199 + fVar204 * local_298 + fVar221 * local_368);
        auVar75 = maxps(auVar75,auVar277);
        uVar67 = -(uint)(local_448 <= auVar75._0_4_);
        uVar68 = -(uint)(local_448 <= auVar75._4_4_);
        uVar69 = -(uint)(local_448 <= auVar75._8_4_);
        uVar70 = -(uint)(local_448 <= auVar75._12_4_);
        fVar144 = (float)((uint)fVar238 & uVar67 | ~uVar67 & (uint)fVar177);
        fVar149 = (float)((uint)fVar247 & uVar68 | ~uVar68 & (uint)fVar200);
        fVar160 = (float)((uint)fVar249 & uVar69 | ~uVar69 & (uint)fVar202);
        fVar161 = (float)((uint)fVar250 & uVar70 | ~uVar70 & (uint)fVar203);
        fVar209 = (float)(~uVar67 & (uint)fVar283 | (uint)fVar293 & uVar67);
        fVar211 = (float)(~uVar68 & (uint)fVar284 | (uint)fVar295 & uVar68);
        fVar214 = (float)(~uVar69 & (uint)fVar174 | (uint)fVar297 & uVar69);
        fVar221 = (float)(~uVar70 & (uint)fVar175 | (uint)fVar299 & uVar70);
        auVar278._0_8_ = CONCAT44(fVar289,fVar285) & 0x7fffffff7fffffff;
        auVar278._8_4_ = ABS(fVar290);
        auVar278._12_4_ = ABS(fVar291);
        auVar234._0_8_ = CONCAT44(fVar133,fVar110) & 0x7fffffff7fffffff;
        auVar234._8_4_ = ABS(fVar135);
        auVar234._12_4_ = ABS(fVar136);
        auVar75 = maxps(auVar278,auVar234);
        auVar207._0_8_ =
             CONCAT44(fVar228 * fVar176 +
                      fVar270 * fVar199 + fVar223 * local_298 + fVar246 * local_368,
                      fVar222 * fVar176 +
                      fVar282 * fVar199 + fVar275 * local_298 + fVar237 * local_368) &
             0x7fffffff7fffffff;
        auVar207._8_4_ =
             ABS(fVar235 * fVar176 + fVar272 * fVar199 + fVar226 * local_298 + fVar248 * local_368);
        auVar207._12_4_ =
             ABS(fVar236 * fVar176 + fVar274 * fVar199 + fVar227 * local_298 + fVar251 * local_368);
        auVar75 = maxps(auVar75,auVar207);
        uVar67 = -(uint)(local_448 <= auVar75._0_4_);
        uVar68 = -(uint)(local_448 <= auVar75._4_4_);
        uVar69 = -(uint)(local_448 <= auVar75._8_4_);
        uVar70 = -(uint)(local_448 <= auVar75._12_4_);
        fVar226 = (float)((uint)fVar285 & uVar67 | ~uVar67 & (uint)fVar177);
        fVar227 = (float)((uint)fVar289 & uVar68 | ~uVar68 & (uint)fVar200);
        fVar237 = (float)((uint)fVar290 & uVar69 | ~uVar69 & (uint)fVar202);
        fVar246 = (float)((uint)fVar291 & uVar70 | ~uVar70 & (uint)fVar203);
        fVar222 = (float)(~uVar67 & (uint)fVar283 | (uint)fVar110 & uVar67);
        fVar235 = (float)(~uVar68 & (uint)fVar284 | (uint)fVar133 & uVar68);
        fVar275 = (float)(~uVar69 & (uint)fVar174 | (uint)fVar135 & uVar69);
        fVar223 = (float)(~uVar70 & (uint)fVar175 | (uint)fVar136 & uVar70);
        auVar124._0_4_ = fVar209 * fVar209 + fVar144 * fVar144;
        auVar124._4_4_ = fVar211 * fVar211 + fVar149 * fVar149;
        auVar124._8_4_ = fVar214 * fVar214 + fVar160 * fVar160;
        auVar124._12_4_ = fVar221 * fVar221 + fVar161 * fVar161;
        auVar75 = rsqrtps(auVar25,auVar124);
        fVar103 = auVar75._0_4_;
        fVar132 = auVar75._4_4_;
        fVar134 = auVar75._8_4_;
        fVar137 = auVar75._12_4_;
        auVar164._0_4_ = fVar103 * fVar103 * auVar124._0_4_ * 0.5 * fVar103;
        auVar164._4_4_ = fVar132 * fVar132 * auVar124._4_4_ * 0.5 * fVar132;
        auVar164._8_4_ = fVar134 * fVar134 * auVar124._8_4_ * 0.5 * fVar134;
        auVar164._12_4_ = fVar137 * fVar137 * auVar124._12_4_ * 0.5 * fVar137;
        fVar248 = fVar103 * 1.5 - auVar164._0_4_;
        fVar251 = fVar132 * 1.5 - auVar164._4_4_;
        fVar282 = fVar134 * 1.5 - auVar164._8_4_;
        fVar283 = fVar137 * 1.5 - auVar164._12_4_;
        auVar125._0_4_ = fVar222 * fVar222 + fVar226 * fVar226;
        auVar125._4_4_ = fVar235 * fVar235 + fVar227 * fVar227;
        auVar125._8_4_ = fVar275 * fVar275 + fVar237 * fVar237;
        auVar125._12_4_ = fVar223 * fVar223 + fVar246 * fVar246;
        auVar75 = rsqrtps(auVar164,auVar125);
        fVar103 = auVar75._0_4_;
        fVar132 = auVar75._4_4_;
        fVar134 = auVar75._8_4_;
        fVar137 = auVar75._12_4_;
        fVar162 = fVar103 * 1.5 - fVar103 * fVar103 * auVar125._0_4_ * 0.5 * fVar103;
        fVar172 = fVar132 * 1.5 - fVar132 * fVar132 * auVar125._4_4_ * 0.5 * fVar132;
        fVar173 = fVar134 * 1.5 - fVar134 * fVar134 * auVar125._8_4_ * 0.5 * fVar134;
        fVar204 = fVar137 * 1.5 - fVar137 * fVar137 * auVar125._12_4_ * 0.5 * fVar137;
        fVar203 = fVar209 * fVar248 * fVar269;
        fVar270 = fVar211 * fVar251 * fVar271;
        fVar272 = fVar214 * fVar282 * fVar273;
        fVar274 = fVar221 * fVar283 * fVar276;
        fVar211 = -fVar144 * fVar248 * fVar269;
        fVar221 = -fVar149 * fVar251 * fVar271;
        fVar228 = -fVar160 * fVar282 * fVar273;
        fVar236 = -fVar161 * fVar283 * fVar276;
        fVar238 = fVar248 * 0.0 * fVar269;
        fVar247 = fVar251 * 0.0 * fVar271;
        fVar249 = fVar282 * 0.0 * fVar273;
        fVar250 = fVar283 * 0.0 * fVar276;
        fVar110 = fVar222 * fVar162 * fVar292;
        fVar133 = fVar235 * fVar172 * fVar294;
        fVar135 = fVar275 * fVar173 * fVar296;
        fVar136 = fVar223 * fVar204 * fVar298;
        fVar144 = fVar205 + fVar110;
        fVar149 = fVar210 + fVar133;
        fVar160 = fVar212 + fVar135;
        fVar161 = fVar213 + fVar136;
        fVar175 = -fVar226 * fVar162 * fVar292;
        fVar177 = -fVar227 * fVar172 * fVar294;
        fVar200 = -fVar237 * fVar173 * fVar296;
        fVar202 = -fVar246 * fVar204 * fVar298;
        fVar103 = fVar258 + fVar175;
        fVar132 = fVar259 + fVar177;
        fVar134 = fVar260 + fVar200;
        fVar137 = fVar261 + fVar202;
        fVar237 = fVar162 * 0.0 * fVar292;
        fVar246 = fVar172 * 0.0 * fVar294;
        fVar248 = fVar173 * 0.0 * fVar296;
        fVar251 = fVar204 * 0.0 * fVar298;
        fVar162 = local_248 - fVar203;
        fVar172 = fStack_244 - fVar270;
        fVar173 = fStack_240 - fVar272;
        fVar204 = fStack_23c - fVar274;
        fVar282 = fVar138 + fVar237;
        fVar283 = fVar145 + fVar246;
        fVar284 = fVar147 + fVar248;
        fVar174 = fVar148 + fVar251;
        fVar209 = local_258 - fVar211;
        fVar214 = fStack_254 - fVar221;
        fVar222 = fStack_250 - fVar228;
        fVar235 = fStack_24c - fVar236;
        fVar275 = fVar74 - fVar238;
        fVar223 = fVar104 - fVar247;
        fVar226 = fVar106 - fVar249;
        fVar227 = fVar108 - fVar250;
        uVar67 = -(uint)(0.0 < (fVar209 * (fVar282 - fVar275) - fVar275 * (fVar103 - fVar209)) * 0.0
                               + (fVar275 * (fVar144 - fVar162) - (fVar282 - fVar275) * fVar162) *
                                 0.0 + ((fVar103 - fVar209) * fVar162 -
                                       (fVar144 - fVar162) * fVar209));
        uVar68 = -(uint)(0.0 < (fVar214 * (fVar283 - fVar223) - fVar223 * (fVar132 - fVar214)) * 0.0
                               + (fVar223 * (fVar149 - fVar172) - (fVar283 - fVar223) * fVar172) *
                                 0.0 + ((fVar132 - fVar214) * fVar172 -
                                       (fVar149 - fVar172) * fVar214));
        uVar69 = -(uint)(0.0 < (fVar222 * (fVar284 - fVar226) - fVar226 * (fVar134 - fVar222)) * 0.0
                               + (fVar226 * (fVar160 - fVar173) - (fVar284 - fVar226) * fVar173) *
                                 0.0 + ((fVar134 - fVar222) * fVar173 -
                                       (fVar160 - fVar173) * fVar222));
        uVar70 = -(uint)(0.0 < (fVar235 * (fVar174 - fVar227) - fVar227 * (fVar137 - fVar235)) * 0.0
                               + (fVar227 * (fVar161 - fVar204) - (fVar174 - fVar227) * fVar204) *
                                 0.0 + ((fVar137 - fVar235) * fVar204 -
                                       (fVar161 - fVar204) * fVar235));
        fVar110 = (float)((uint)(fVar205 - fVar110) & uVar67 | ~uVar67 & (uint)(local_248 + fVar203)
                         );
        fVar270 = (float)((uint)(fVar210 - fVar133) & uVar68 |
                         ~uVar68 & (uint)(fStack_244 + fVar270));
        fVar272 = (float)((uint)(fVar212 - fVar135) & uVar69 |
                         ~uVar69 & (uint)(fStack_240 + fVar272));
        fVar213 = (float)((uint)(fVar213 - fVar136) & uVar70 |
                         ~uVar70 & (uint)(fStack_23c + fVar274));
        fVar175 = (float)((uint)(fVar258 - fVar175) & uVar67 | ~uVar67 & (uint)(local_258 + fVar211)
                         );
        fVar177 = (float)((uint)(fVar259 - fVar177) & uVar68 |
                         ~uVar68 & (uint)(fStack_254 + fVar221));
        fVar200 = (float)((uint)(fVar260 - fVar200) & uVar69 |
                         ~uVar69 & (uint)(fStack_250 + fVar228));
        fVar202 = (float)((uint)(fVar261 - fVar202) & uVar70 |
                         ~uVar70 & (uint)(fStack_24c + fVar236));
        fVar258 = (float)((uint)(fVar138 - fVar237) & uVar67 | ~uVar67 & (uint)(fVar74 + fVar238));
        fVar259 = (float)((uint)(fVar145 - fVar246) & uVar68 | ~uVar68 & (uint)(fVar104 + fVar247));
        fVar260 = (float)((uint)(fVar147 - fVar248) & uVar69 | ~uVar69 & (uint)(fVar106 + fVar249));
        fVar261 = (float)((uint)(fVar148 - fVar251) & uVar70 | ~uVar70 & (uint)(fVar108 + fVar250));
        fVar237 = (float)((uint)fVar162 & uVar67 | ~uVar67 & (uint)fVar144);
        fVar246 = (float)((uint)fVar172 & uVar68 | ~uVar68 & (uint)fVar149);
        fVar248 = (float)((uint)fVar173 & uVar69 | ~uVar69 & (uint)fVar160);
        fVar251 = (float)((uint)fVar204 & uVar70 | ~uVar70 & (uint)fVar161);
        fVar211 = (float)((uint)fVar209 & uVar67 | ~uVar67 & (uint)fVar103);
        fVar221 = (float)((uint)fVar214 & uVar68 | ~uVar68 & (uint)fVar132);
        fVar228 = (float)((uint)fVar222 & uVar69 | ~uVar69 & (uint)fVar134);
        fVar236 = (float)((uint)fVar235 & uVar70 | ~uVar70 & (uint)fVar137);
        fVar203 = (float)((uint)fVar275 & uVar67 | ~uVar67 & (uint)fVar282);
        fVar205 = (float)((uint)fVar223 & uVar68 | ~uVar68 & (uint)fVar283);
        fVar210 = (float)((uint)fVar226 & uVar69 | ~uVar69 & (uint)fVar284);
        fVar212 = (float)((uint)fVar227 & uVar70 | ~uVar70 & (uint)fVar174);
        fVar162 = (float)((uint)fVar144 & uVar67 | ~uVar67 & (uint)fVar162) - fVar110;
        fVar172 = (float)((uint)fVar149 & uVar68 | ~uVar68 & (uint)fVar172) - fVar270;
        fVar173 = (float)((uint)fVar160 & uVar69 | ~uVar69 & (uint)fVar173) - fVar272;
        fVar204 = (float)((uint)fVar161 & uVar70 | ~uVar70 & (uint)fVar204) - fVar213;
        fVar103 = (float)((uint)fVar103 & uVar67 | ~uVar67 & (uint)fVar209) - fVar175;
        fVar132 = (float)((uint)fVar132 & uVar68 | ~uVar68 & (uint)fVar214) - fVar177;
        fVar134 = (float)((uint)fVar134 & uVar69 | ~uVar69 & (uint)fVar222) - fVar200;
        fVar137 = (float)((uint)fVar137 & uVar70 | ~uVar70 & (uint)fVar235) - fVar202;
        fVar275 = (float)((uint)fVar282 & uVar67 | ~uVar67 & (uint)fVar275) - fVar258;
        fVar223 = (float)((uint)fVar283 & uVar68 | ~uVar68 & (uint)fVar223) - fVar259;
        fVar226 = (float)((uint)fVar284 & uVar69 | ~uVar69 & (uint)fVar226) - fVar260;
        fVar227 = (float)((uint)fVar174 & uVar70 | ~uVar70 & (uint)fVar227) - fVar261;
        fVar274 = fVar110 - fVar237;
        fVar74 = fVar270 - fVar246;
        fVar104 = fVar272 - fVar248;
        fVar106 = fVar213 - fVar251;
        fVar209 = fVar175 - fVar211;
        fVar214 = fVar177 - fVar221;
        fVar222 = fVar200 - fVar228;
        fVar235 = fVar202 - fVar236;
        fVar144 = fVar258 - fVar203;
        fVar149 = fVar259 - fVar205;
        fVar160 = fVar260 - fVar210;
        fVar161 = fVar261 - fVar212;
        fVar282 = (fVar175 * fVar275 - fVar258 * fVar103) * 0.0 +
                  (fVar258 * fVar162 - fVar110 * fVar275) * 0.0 +
                  (fVar110 * fVar103 - fVar175 * fVar162);
        fVar283 = (fVar177 * fVar223 - fVar259 * fVar132) * 0.0 +
                  (fVar259 * fVar172 - fVar270 * fVar223) * 0.0 +
                  (fVar270 * fVar132 - fVar177 * fVar172);
        auVar156._4_4_ = fVar283;
        auVar156._0_4_ = fVar282;
        fVar284 = (fVar200 * fVar226 - fVar260 * fVar134) * 0.0 +
                  (fVar260 * fVar173 - fVar272 * fVar226) * 0.0 +
                  (fVar272 * fVar134 - fVar200 * fVar173);
        fVar174 = (fVar202 * fVar227 - fVar261 * fVar137) * 0.0 +
                  (fVar261 * fVar204 - fVar213 * fVar227) * 0.0 +
                  (fVar213 * fVar137 - fVar202 * fVar204);
        auVar286._0_4_ =
             (fVar211 * fVar144 - fVar203 * fVar209) * 0.0 +
             (fVar203 * fVar274 - fVar237 * fVar144) * 0.0 + (fVar237 * fVar209 - fVar211 * fVar274)
        ;
        auVar286._4_4_ =
             (fVar221 * fVar149 - fVar205 * fVar214) * 0.0 +
             (fVar205 * fVar74 - fVar246 * fVar149) * 0.0 + (fVar246 * fVar214 - fVar221 * fVar74);
        auVar286._8_4_ =
             (fVar228 * fVar160 - fVar210 * fVar222) * 0.0 +
             (fVar210 * fVar104 - fVar248 * fVar160) * 0.0 + (fVar248 * fVar222 - fVar228 * fVar104)
        ;
        auVar286._12_4_ =
             (fVar236 * fVar161 - fVar212 * fVar235) * 0.0 +
             (fVar212 * fVar106 - fVar251 * fVar161) * 0.0 + (fVar251 * fVar235 - fVar236 * fVar106)
        ;
        auVar156._8_4_ = fVar284;
        auVar156._12_4_ = fVar174;
        auVar75 = maxps(auVar156,auVar286);
        bVar49 = auVar75._0_4_ <= 0.0 && bVar49;
        auVar157._0_4_ = -(uint)bVar49;
        bVar50 = auVar75._4_4_ <= 0.0 && bVar50;
        auVar157._4_4_ = -(uint)bVar50;
        bVar48 = auVar75._8_4_ <= 0.0 && bVar48;
        auVar157._8_4_ = -(uint)bVar48;
        bVar63 = auVar75._12_4_ <= 0.0 && bVar63;
        auVar157._12_4_ = -(uint)bVar63;
        iVar53 = movmskps(iVar53,auVar157);
        if (iVar53 == 0) {
LAB_00b4e21b:
          iVar53 = 0;
          auVar96._8_8_ = uStack_3a0;
          auVar96._0_8_ = local_3a8;
        }
        else {
          auVar165._0_4_ = fVar144 * fVar103;
          auVar165._4_4_ = fVar149 * fVar132;
          auVar165._8_4_ = fVar160 * fVar134;
          auVar165._12_4_ = fVar161 * fVar137;
          fVar211 = fVar209 * fVar275 - auVar165._0_4_;
          fVar221 = fVar214 * fVar223 - auVar165._4_4_;
          fVar228 = fVar222 * fVar226 - auVar165._8_4_;
          fVar236 = fVar235 * fVar227 - auVar165._12_4_;
          fVar144 = fVar144 * fVar162 - fVar275 * fVar274;
          fVar149 = fVar149 * fVar172 - fVar223 * fVar74;
          fVar160 = fVar160 * fVar173 - fVar226 * fVar104;
          fVar161 = fVar161 * fVar204 - fVar227 * fVar106;
          fVar103 = fVar274 * fVar103 - fVar209 * fVar162;
          fVar172 = fVar74 * fVar132 - fVar214 * fVar172;
          fVar173 = fVar104 * fVar134 - fVar222 * fVar173;
          fVar204 = fVar106 * fVar137 - fVar235 * fVar204;
          auVar195._0_4_ = fVar211 * 0.0 + fVar144 * 0.0 + fVar103;
          auVar195._4_4_ = fVar221 * 0.0 + fVar149 * 0.0 + fVar172;
          auVar195._8_4_ = fVar228 * 0.0 + fVar160 * 0.0 + fVar173;
          auVar195._12_4_ = fVar236 * 0.0 + fVar161 * 0.0 + fVar204;
          auVar75 = rcpps(auVar165,auVar195);
          fVar132 = auVar75._0_4_;
          fVar134 = auVar75._4_4_;
          fVar137 = auVar75._8_4_;
          fVar162 = auVar75._12_4_;
          fVar132 = (1.0 - auVar195._0_4_ * fVar132) * fVar132 + fVar132;
          fVar134 = (1.0 - auVar195._4_4_ * fVar134) * fVar134 + fVar134;
          fVar137 = (1.0 - auVar195._8_4_ * fVar137) * fVar137 + fVar137;
          fVar162 = (1.0 - auVar195._12_4_ * fVar162) * fVar162 + fVar162;
          fVar144 = (fVar258 * fVar103 + fVar175 * fVar144 + fVar110 * fVar211) * fVar132;
          fVar149 = (fVar259 * fVar172 + fVar177 * fVar149 + fVar270 * fVar221) * fVar134;
          fVar160 = (fVar260 * fVar173 + fVar200 * fVar160 + fVar272 * fVar228) * fVar137;
          fVar161 = (fVar261 * fVar204 + fVar202 * fVar161 + fVar213 * fVar236) * fVar162;
          fVar103 = *(float *)(ray + k * 4 + 0x80);
          bVar49 = (fVar144 <= fVar103 && fVar146 <= fVar144) && bVar49;
          auVar166._0_4_ = -(uint)bVar49;
          bVar50 = (fVar149 <= fVar103 && fVar146 <= fVar149) && bVar50;
          auVar166._4_4_ = -(uint)bVar50;
          bVar48 = (fVar160 <= fVar103 && fVar146 <= fVar160) && bVar48;
          auVar166._8_4_ = -(uint)bVar48;
          bVar63 = (fVar161 <= fVar103 && fVar146 <= fVar161) && bVar63;
          auVar166._12_4_ = -(uint)bVar63;
          iVar53 = movmskps(iVar53,auVar166);
          if (iVar53 == 0) goto LAB_00b4e21b;
          auVar167._0_8_ =
               CONCAT44(-(uint)(auVar195._4_4_ != 0.0 && bVar50),
                        -(uint)(auVar195._0_4_ != 0.0 && bVar49));
          auVar167._8_4_ = -(uint)(auVar195._8_4_ != 0.0 && bVar48);
          auVar167._12_4_ = -(uint)(auVar195._12_4_ != 0.0 && bVar63);
          iVar53 = movmskps(iVar53,auVar167);
          auVar96._8_8_ = uStack_3a0;
          auVar96._0_8_ = local_3a8;
          if (iVar53 != 0) {
            fVar282 = fVar282 * fVar132;
            fVar283 = fVar283 * fVar134;
            fVar284 = fVar284 * fVar137;
            fVar174 = fVar174 * fVar162;
            local_3d8 = (float)((uint)(1.0 - fVar282) & uVar67 | ~uVar67 & (uint)fVar282);
            fStack_3d4 = (float)((uint)(1.0 - fVar283) & uVar68 | ~uVar68 & (uint)fVar283);
            fStack_3d0 = (float)((uint)(1.0 - fVar284) & uVar69 | ~uVar69 & (uint)fVar284);
            fStack_3cc = (float)((uint)(1.0 - fVar174) & uVar70 | ~uVar70 & (uint)fVar174);
            local_278 = (float)(~uVar67 & (uint)(auVar286._0_4_ * fVar132) |
                               (uint)(1.0 - auVar286._0_4_ * fVar132) & uVar67);
            fStack_274 = (float)(~uVar68 & (uint)(auVar286._4_4_ * fVar134) |
                                (uint)(1.0 - auVar286._4_4_ * fVar134) & uVar68);
            fStack_270 = (float)(~uVar69 & (uint)(auVar286._8_4_ * fVar137) |
                                (uint)(1.0 - auVar286._8_4_ * fVar137) & uVar69);
            fStack_26c = (float)(~uVar70 & (uint)(auVar286._12_4_ * fVar162) |
                                (uint)(1.0 - auVar286._12_4_ * fVar162) & uVar70);
            auVar96._8_4_ = auVar167._8_4_;
            auVar96._0_8_ = auVar167._0_8_;
            auVar96._12_4_ = auVar167._12_4_;
            local_3e8 = fVar144;
            fStack_3e4 = fVar149;
            fStack_3e0 = fVar160;
            fStack_3dc = fVar161;
          }
        }
        iVar53 = movmskps(iVar53,auVar96);
        _local_388 = auVar155;
        if (iVar53 == 0) goto LAB_00b4d2a4;
        fVar269 = (fVar292 - fVar269) * local_3d8 + fVar269;
        fVar271 = (fVar294 - fVar271) * fStack_3d4 + fVar271;
        fVar273 = (fVar296 - fVar273) * fStack_3d0 + fVar273;
        fVar276 = (fVar298 - fVar276) * fStack_3cc + fVar276;
        fVar146 = *(float *)((long)local_340->ray_space + k * 4 + -0x10);
        auVar126._0_4_ = -(uint)(fVar146 * (fVar269 + fVar269) < local_3e8) & auVar96._0_4_;
        auVar126._4_4_ = -(uint)(fVar146 * (fVar271 + fVar271) < fStack_3e4) & auVar96._4_4_;
        auVar126._8_4_ = -(uint)(fVar146 * (fVar273 + fVar273) < fStack_3e0) & auVar96._8_4_;
        auVar126._12_4_ = -(uint)(fVar146 * (fVar276 + fVar276) < fStack_3dc) & auVar96._12_4_;
        uVar67 = movmskps((int)local_340,auVar126);
        if (uVar67 == 0) goto LAB_00b4d2a4;
        local_278 = local_278 + local_278 + -1.0;
        fStack_274 = fStack_274 + fStack_274 + -1.0;
        fStack_270 = fStack_270 + fStack_270 + -1.0;
        fStack_26c = fStack_26c + fStack_26c + -1.0;
        local_198 = 0;
        local_188 = CONCAT44(fStack_2c4,local_2c8);
        uStack_180 = CONCAT44(fStack_2bc,fStack_2c0);
        local_178 = CONCAT44(fStack_2d4,local_2d8);
        uStack_170 = CONCAT44(fStack_2cc,fStack_2d0);
        local_168 = CONCAT44(fStack_2e4,local_2e8);
        uStack_160 = CONCAT44(fStack_2dc,fStack_2e0);
        local_158 = CONCAT44(fStack_2b4,local_2b8);
        uStack_150 = CONCAT44(fStack_2ac,fStack_2b0);
        pRVar58 = (RTCIntersectArguments *)(ulong)*(uint *)(ray + k * 4 + 0x90);
        local_1c8 = local_3d8;
        fStack_1c4 = fStack_3d4;
        fStack_1c0 = fStack_3d0;
        fStack_1bc = fStack_3cc;
        local_1b8 = local_278;
        fStack_1b4 = fStack_274;
        fStack_1b0 = fStack_270;
        fStack_1ac = fStack_26c;
        local_1a8 = local_3e8;
        fStack_1a4 = fStack_3e4;
        fStack_1a0 = fStack_3e0;
        fStack_19c = fStack_3dc;
        local_194 = iVar19;
        local_148 = auVar126;
        if ((pGVar20->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) goto LAB_00b4d2a4;
        pRVar58 = context->args;
        if ((pRVar58->filter != (RTCFilterFunctionN)0x0) ||
           (bVar63 = true, pGVar20->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
          fVar73 = 1.0 / fVar73;
          local_138[0] = fVar73 * (local_3d8 + 0.0);
          local_138[1] = fVar73 * (fStack_3d4 + 1.0);
          local_138[2] = fVar73 * (fStack_3d0 + 2.0);
          local_138[3] = fVar73 * (fStack_3cc + 3.0);
          local_128 = CONCAT44(fStack_274,local_278);
          uStack_120 = CONCAT44(fStack_26c,fStack_270);
          local_118[0] = local_3e8;
          local_118[1] = fStack_3e4;
          local_118[2] = fStack_3e0;
          local_118[3] = fStack_3dc;
          pGVar61 = (Geometry *)(ulong)(uVar67 & 0xff);
          uVar62 = 0;
          if (pGVar61 != (Geometry *)0x0) {
            for (; ((uVar67 & 0xff) >> uVar62 & 1) == 0; uVar62 = uVar62 + 1) {
            }
          }
          uVar52 = (undefined4)local_3b0;
          local_428 = CONCAT44((undefined4)local_2f8,(undefined4)local_2f8);
          uStack_420._0_4_ = (undefined4)local_2f8;
          uStack_420._4_4_ = (undefined4)local_2f8;
          auVar75 = *local_348;
          uVar57 = *(undefined4 *)(ray + k * 4 + 0x80);
          do {
            local_d8 = local_138[uVar62];
            local_c8 = *(undefined4 *)((long)&local_128 + uVar62 * 4);
            *(float *)(ray + k * 4 + 0x80) = local_118[uVar62];
            fVar134 = 1.0 - local_d8;
            fVar146 = local_d8 * 3.0;
            fVar132 = ((fVar146 + 2.0) * (fVar134 + fVar134) + fVar134 * -3.0 * fVar134) * 0.5;
            fVar73 = (local_d8 * local_d8 + fVar134 * -2.0 * local_d8) * 0.5;
            fVar103 = (local_d8 * fVar146 + (fVar146 + -5.0) * (local_d8 + local_d8)) * 0.5;
            local_338.context = context->user;
            fVar146 = (local_d8 * (fVar134 + fVar134) - fVar134 * fVar134) * 0.5;
            local_108 = fVar146 * local_2c8 +
                        fVar103 * local_2d8 + fVar132 * local_2e8 + fVar73 * local_2b8;
            local_f8 = fVar146 * fStack_2c4 +
                       fVar103 * fStack_2d4 + fVar132 * fStack_2e4 + fVar73 * fStack_2b4;
            local_e8 = fVar146 * fStack_2c0 +
                       fVar103 * fStack_2d0 + fVar132 * fStack_2e0 + fVar73 * fStack_2b0;
            fStack_104 = local_108;
            fStack_100 = local_108;
            fStack_fc = local_108;
            fStack_f4 = local_f8;
            fStack_f0 = local_f8;
            fStack_ec = local_f8;
            fStack_e4 = local_e8;
            fStack_e0 = local_e8;
            fStack_dc = local_e8;
            fStack_d4 = local_d8;
            fStack_d0 = local_d8;
            fStack_cc = local_d8;
            uStack_c4 = local_c8;
            uStack_c0 = local_c8;
            uStack_bc = local_c8;
            local_b8 = local_428;
            uStack_b0 = uStack_420;
            local_a8 = CONCAT44(uVar52,uVar52);
            uStack_a0 = CONCAT44(uVar52,uVar52);
            local_98 = (local_338.context)->instID[0];
            uStack_94 = local_98;
            uStack_90 = local_98;
            uStack_8c = local_98;
            local_88 = (local_338.context)->instPrimID[0];
            uStack_84 = local_88;
            uStack_80 = local_88;
            uStack_7c = local_88;
            local_338.valid = (int *)local_3c8;
            pRVar58 = (RTCIntersectArguments *)pGVar20->userPtr;
            local_338.hit = (RTCHitN *)&local_108;
            local_338.N = 4;
            p_Var55 = pGVar20->occlusionFilterN;
            local_3c8 = auVar75;
            local_338.geometryUserPtr = pRVar58;
            local_338.ray = (RTCRayN *)ray;
            if (p_Var55 != (RTCFilterFunctionN)0x0) {
              p_Var55 = (RTCFilterFunctionN)(*p_Var55)(&local_338);
            }
            auVar127._0_4_ = -(uint)(local_3c8._0_4_ == 0);
            auVar127._4_4_ = -(uint)(local_3c8._4_4_ == 0);
            auVar127._8_4_ = -(uint)(local_3c8._8_4_ == 0);
            auVar127._12_4_ = -(uint)(local_3c8._12_4_ == 0);
            uVar67 = movmskps((int)p_Var55,auVar127);
            pRVar56 = (RTCRayN *)(ulong)(uVar67 ^ 0xf);
            if ((uVar67 ^ 0xf) == 0) {
              auVar127 = auVar127 ^ _DAT_01f7ae20;
            }
            else {
              pRVar58 = context->args;
              if ((pRVar58->filter != (RTCFilterFunctionN)0x0) &&
                 (((pRVar58->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar20->field_8).field_0x2 & 0x40) != 0))))
              {
                (*pRVar58->filter)(&local_338);
              }
              auVar97._0_4_ = -(uint)(local_3c8._0_4_ == 0);
              auVar97._4_4_ = -(uint)(local_3c8._4_4_ == 0);
              auVar97._8_4_ = -(uint)(local_3c8._8_4_ == 0);
              auVar97._12_4_ = -(uint)(local_3c8._12_4_ == 0);
              auVar127 = auVar97 ^ _DAT_01f7ae20;
              *(undefined1 (*) [16])(local_338.ray + 0x80) =
                   ~auVar97 & _DAT_01f7aa00 | *(undefined1 (*) [16])(local_338.ray + 0x80) & auVar97
              ;
              pRVar56 = local_338.ray;
            }
            auVar128._0_4_ = auVar127._0_4_ << 0x1f;
            auVar128._4_4_ = auVar127._4_4_ << 0x1f;
            auVar128._8_4_ = auVar127._8_4_ << 0x1f;
            auVar128._12_4_ = auVar127._12_4_ << 0x1f;
            iVar53 = movmskps((int)pRVar56,auVar128);
            if (iVar53 != 0) {
              bVar63 = true;
              break;
            }
            *(undefined4 *)(ray + k * 4 + 0x80) = uVar57;
            pGVar61 = (Geometry *)((ulong)pGVar61 ^ 1L << (uVar62 & 0x3f));
            uVar62 = 0;
            if (pGVar61 != (Geometry *)0x0) {
              for (; ((ulong)pGVar61 >> uVar62 & 1) == 0; uVar62 = uVar62 + 1) {
              }
            }
            bVar63 = false;
          } while (pGVar61 != (Geometry *)0x0);
        }
      }
      uVar57 = SUB84(pRVar58,0);
      if (4 < iVar19) {
        local_58 = iVar19;
        iStack_54 = iVar19;
        iStack_50 = iVar19;
        iStack_4c = iVar19;
        local_2a8._4_4_ = local_2a8._0_4_;
        fStack_2a0 = (float)local_2a8._0_4_;
        fStack_29c = (float)local_2a8._0_4_;
        local_78 = 1.0 / (float)local_308._0_4_;
        fStack_74 = local_78;
        fStack_70 = local_78;
        fStack_6c = local_78;
        local_308._4_4_ = (undefined4)local_3b0;
        local_308._0_4_ = (undefined4)local_3b0;
        local_308._8_4_ = (undefined4)local_3b0;
        local_308._12_4_ = (undefined4)local_3b0;
        local_68 = (undefined4)local_2f8;
        uStack_64 = (undefined4)local_2f8;
        uStack_60 = (undefined4)local_2f8;
        uStack_5c = (undefined4)local_2f8;
        lVar65 = 4;
        do {
          uVar68 = (uint)lVar65;
          puVar59 = catmullrom_basis0 + lVar23;
          pauVar8 = (undefined1 (*) [16])(puVar59 + lVar65 * 4);
          fVar146 = *(float *)*pauVar8;
          fVar73 = *(float *)(*pauVar8 + 4);
          fVar103 = *(float *)(*pauVar8 + 8);
          auVar27 = *(undefined1 (*) [12])*pauVar8;
          fVar132 = *(float *)(*pauVar8 + 0xc);
          _local_388 = *pauVar8;
          pfVar1 = (float *)(lVar23 + 0x21b37f0 + lVar65 * 4);
          fVar134 = *pfVar1;
          fVar137 = pfVar1[1];
          fVar144 = pfVar1[2];
          fVar149 = pfVar1[3];
          pfVar1 = (float *)(lVar23 + 0x21b3c74 + lVar65 * 4);
          fVar160 = *pfVar1;
          fVar161 = pfVar1[1];
          fVar162 = pfVar1[2];
          fVar172 = pfVar1[3];
          pfVar1 = (float *)(lVar23 + 0x21b40f8 + lVar65 * 4);
          fVar173 = *pfVar1;
          fVar204 = pfVar1[1];
          fVar209 = pfVar1[2];
          fVar211 = pfVar1[3];
          local_248 = local_1d8 * fVar146 +
                      local_398 * fVar134 + local_358 * fVar160 + fVar105 * fVar173;
          fStack_244 = fStack_1d4 * fVar73 +
                       fStack_394 * fVar137 + fStack_354 * fVar161 + fVar105 * fVar204;
          fStack_240 = fStack_1d0 * fVar103 +
                       fStack_390 * fVar144 + fStack_350 * fVar162 + fVar105 * fVar209;
          fStack_23c = fStack_1cc * fVar132 +
                       fStack_38c * fVar149 + fStack_34c * fVar172 + fVar105 * fVar211;
          local_258 = local_1e8 * fVar146 +
                      local_378 * fVar134 + fVar201 * fVar160 + fVar109 * fVar173;
          fStack_254 = fStack_1e4 * fVar73 +
                       fStack_374 * fVar137 + fVar201 * fVar161 + fVar109 * fVar204;
          fStack_250 = fStack_1e0 * fVar103 +
                       fStack_370 * fVar144 + fVar201 * fVar162 + fVar109 * fVar209;
          fStack_24c = fStack_1dc * fVar132 +
                       fStack_36c * fVar149 + fVar201 * fVar172 + fVar109 * fVar211;
          auVar279._0_4_ =
               local_228 * fVar146 + local_218 * fVar134 + local_1f8 * fVar160 + local_208 * fVar173
          ;
          auVar279._4_4_ =
               fStack_224 * fVar73 +
               fStack_214 * fVar137 + fStack_1f4 * fVar161 + fStack_204 * fVar204;
          auVar279._8_4_ =
               fStack_220 * fVar103 +
               fStack_210 * fVar144 + fStack_1f0 * fVar162 + fStack_200 * fVar209;
          auVar279._12_4_ =
               fStack_21c * fVar132 +
               fStack_20c * fVar149 + fStack_1ec * fVar172 + fStack_1fc * fVar211;
          pfVar1 = (float *)(catmullrom_basis1 + lVar23 + lVar65 * 4);
          fVar146 = *pfVar1;
          fVar73 = pfVar1[1];
          fVar103 = pfVar1[2];
          fVar214 = pfVar1[3];
          pfVar1 = (float *)(lVar23 + 0x21b5c10 + lVar65 * 4);
          fVar221 = *pfVar1;
          fVar222 = pfVar1[1];
          fVar228 = pfVar1[2];
          fVar235 = pfVar1[3];
          pfVar1 = (float *)(lVar23 + 0x21b6094 + lVar65 * 4);
          fVar236 = *pfVar1;
          fVar275 = pfVar1[1];
          fVar223 = pfVar1[2];
          fVar226 = pfVar1[3];
          pfVar1 = (float *)(lVar23 + 0x21b6518 + lVar65 * 4);
          fVar227 = *pfVar1;
          fVar237 = pfVar1[1];
          fVar246 = pfVar1[2];
          fVar248 = pfVar1[3];
          fVar276 = local_1d8 * fVar146 +
                    local_398 * fVar221 + local_358 * fVar236 + fVar105 * fVar227;
          fVar282 = fStack_1d4 * fVar73 +
                    fStack_394 * fVar222 + fStack_354 * fVar275 + fVar105 * fVar237;
          fVar283 = fStack_1d0 * fVar103 +
                    fStack_390 * fVar228 + fStack_350 * fVar223 + fVar105 * fVar246;
          fVar284 = fStack_1cc * fVar214 +
                    fStack_38c * fVar235 + fStack_34c * fVar226 + fVar105 * fVar248;
          fVar202 = local_1e8 * fVar146 +
                    local_378 * fVar221 + fVar201 * fVar236 + fVar109 * fVar227;
          fVar203 = fStack_1e4 * fVar73 +
                    fStack_374 * fVar222 + fVar201 * fVar275 + fVar109 * fVar237;
          fVar205 = fStack_1e0 * fVar103 +
                    fStack_370 * fVar228 + fVar201 * fVar223 + fVar109 * fVar246;
          fVar210 = fStack_1dc * fVar214 +
                    fStack_36c * fVar235 + fVar201 * fVar226 + fVar109 * fVar248;
          auVar287._0_4_ =
               local_228 * fVar146 + local_218 * fVar221 + local_1f8 * fVar236 + local_208 * fVar227
          ;
          auVar287._4_4_ =
               fStack_224 * fVar73 +
               fStack_214 * fVar222 + fStack_1f4 * fVar275 + fStack_204 * fVar237;
          auVar287._8_4_ =
               fStack_220 * fVar103 +
               fStack_210 * fVar228 + fStack_1f0 * fVar223 + fStack_200 * fVar246;
          auVar287._12_4_ =
               fStack_21c * fVar214 +
               fStack_20c * fVar235 + fStack_1ec * fVar226 + fStack_1fc * fVar248;
          fVar261 = fVar276 - local_248;
          fVar269 = fVar282 - fStack_244;
          fVar271 = fVar283 - fStack_240;
          fVar273 = fVar284 - fStack_23c;
          fVar251 = fVar202 - local_258;
          fVar258 = fVar203 - fStack_254;
          fVar259 = fVar205 - fStack_250;
          fVar260 = fVar210 - fStack_24c;
          fVar174 = local_258 * fVar261 - local_248 * fVar251;
          fVar175 = fStack_254 * fVar269 - fStack_244 * fVar258;
          fVar177 = fStack_250 * fVar271 - fStack_240 * fVar259;
          fVar200 = fStack_24c * fVar273 - fStack_23c * fVar260;
          auVar75 = maxps(auVar279,auVar287);
          bVar48 = fVar174 * fVar174 <=
                   auVar75._0_4_ * auVar75._0_4_ * (fVar261 * fVar261 + fVar251 * fVar251) &&
                   (int)uVar68 < local_58;
          auVar220._0_4_ = -(uint)bVar48;
          bVar49 = fVar175 * fVar175 <=
                   auVar75._4_4_ * auVar75._4_4_ * (fVar269 * fVar269 + fVar258 * fVar258) &&
                   (int)(uVar68 | 1) < iStack_54;
          auVar220._4_4_ = -(uint)bVar49;
          bVar50 = fVar177 * fVar177 <=
                   auVar75._8_4_ * auVar75._8_4_ * (fVar271 * fVar271 + fVar259 * fVar259) &&
                   (int)(uVar68 | 2) < iStack_50;
          auVar220._8_4_ = -(uint)bVar50;
          bVar51 = fVar200 * fVar200 <=
                   auVar75._12_4_ * auVar75._12_4_ * (fVar273 * fVar273 + fVar260 * fVar260) &&
                   (int)(uVar68 | 3) < iStack_4c;
          auVar220._12_4_ = -(uint)bVar51;
          uVar67 = movmskps((int)pGVar61,auVar220);
          pGVar61 = (Geometry *)(ulong)uVar67;
          if (uVar67 != 0) {
            local_2f8 = CONCAT44(fVar269,fVar261);
            fVar294 = fVar227 * local_368 + fVar236 * local_298 + fVar221 * fVar199 +
                      fVar146 * fVar176;
            fVar296 = fVar237 * fStack_364 + fVar275 * fStack_294 + fVar222 * fVar199 +
                      fVar73 * fVar176;
            fVar298 = fVar246 * fStack_360 + fVar223 * fStack_290 + fVar228 * fVar199 +
                      fVar103 * fVar176;
            fVar270 = fVar248 * fStack_35c + fVar226 * fStack_28c + fVar235 * fVar199 +
                      fVar214 * fVar176;
            local_388._0_4_ = auVar27._0_4_;
            local_388._4_4_ = auVar27._4_4_;
            fStack_380 = auVar27._8_4_;
            fVar106 = fVar173 * local_368 + fVar160 * local_298 + fVar134 * fVar199 +
                      (float)local_388._0_4_ * fVar176;
            fVar108 = fVar204 * fStack_364 + fVar161 * fStack_294 + fVar137 * fVar199 +
                      (float)local_388._4_4_ * fVar176;
            fVar110 = fVar209 * fStack_360 + fVar162 * fStack_290 + fVar144 * fVar199 +
                      fStack_380 * fVar176;
            fVar133 = fVar211 * fStack_35c + fVar172 * fStack_28c + fVar149 * fVar199 +
                      fVar132 * fVar176;
            pfVar1 = (float *)(lVar23 + 0x21b457c + lVar65 * 4);
            fVar146 = *pfVar1;
            fVar73 = pfVar1[1];
            fVar103 = pfVar1[2];
            fVar132 = pfVar1[3];
            pfVar1 = (float *)(lVar23 + 0x21b4a00 + lVar65 * 4);
            fVar134 = *pfVar1;
            fVar137 = pfVar1[1];
            fVar144 = pfVar1[2];
            fVar149 = pfVar1[3];
            pfVar1 = (float *)(lVar23 + 0x21b4e84 + lVar65 * 4);
            fVar160 = *pfVar1;
            fVar161 = pfVar1[1];
            fVar162 = pfVar1[2];
            fVar172 = pfVar1[3];
            pfVar1 = (float *)(lVar23 + 0x21b5308 + lVar65 * 4);
            fVar173 = *pfVar1;
            fVar204 = pfVar1[1];
            fVar209 = pfVar1[2];
            fVar211 = pfVar1[3];
            fVar135 = local_1d8 * fVar146 +
                      local_398 * fVar134 + local_358 * fVar160 + fVar105 * fVar173;
            fVar136 = fStack_1d4 * fVar73 +
                      fStack_394 * fVar137 + fStack_354 * fVar161 + fVar105 * fVar204;
            fVar138 = fStack_1d0 * fVar103 +
                      fStack_390 * fVar144 + fStack_350 * fVar162 + fVar105 * fVar209;
            fVar145 = fStack_1cc * fVar132 +
                      fStack_38c * fVar149 + fStack_34c * fVar172 + fVar105 * fVar211;
            fVar200 = local_1e8 * fVar146 +
                      local_378 * fVar134 + fVar201 * fVar160 + fVar109 * fVar173;
            fVar212 = fStack_1e4 * fVar73 +
                      fStack_374 * fVar137 + fVar201 * fVar161 + fVar109 * fVar204;
            fVar213 = fStack_1e0 * fVar103 +
                      fStack_370 * fVar144 + fVar201 * fVar162 + fVar109 * fVar209;
            fVar292 = fStack_1dc * fVar132 +
                      fStack_36c * fVar149 + fVar201 * fVar172 + fVar109 * fVar211;
            pfVar1 = (float *)(lVar23 + 0x21b699c + lVar65 * 4);
            fVar214 = *pfVar1;
            fVar221 = pfVar1[1];
            fVar222 = pfVar1[2];
            fVar228 = pfVar1[3];
            pfVar1 = (float *)(lVar23 + 0x21b72a4 + lVar65 * 4);
            fVar235 = *pfVar1;
            fVar236 = pfVar1[1];
            fVar275 = pfVar1[2];
            fVar223 = pfVar1[3];
            pfVar1 = (float *)(lVar23 + 0x21b7728 + lVar65 * 4);
            fVar226 = *pfVar1;
            fVar227 = pfVar1[1];
            fVar237 = pfVar1[2];
            fVar246 = pfVar1[3];
            pfVar1 = (float *)(lVar23 + 0x21b6e20 + lVar65 * 4);
            fVar248 = *pfVar1;
            fVar174 = pfVar1[1];
            fVar175 = pfVar1[2];
            fVar177 = pfVar1[3];
            fVar147 = local_1d8 * fVar214 +
                      local_398 * fVar248 + local_358 * fVar235 + fVar105 * fVar226;
            fVar148 = fStack_1d4 * fVar221 +
                      fStack_394 * fVar174 + fStack_354 * fVar236 + fVar105 * fVar227;
            fVar238 = fStack_1d0 * fVar222 +
                      fStack_390 * fVar175 + fStack_350 * fVar275 + fVar105 * fVar237;
            fVar247 = fStack_1cc * fVar228 +
                      fStack_38c * fVar177 + fStack_34c * fVar223 + fVar105 * fVar246;
            fVar272 = local_1e8 * fVar214 +
                      local_378 * fVar248 + fVar201 * fVar235 + fVar109 * fVar226;
            fVar274 = fStack_1e4 * fVar221 +
                      fStack_374 * fVar174 + fVar201 * fVar236 + fVar109 * fVar227;
            fVar74 = fStack_1e0 * fVar222 +
                     fStack_370 * fVar175 + fVar201 * fVar275 + fVar109 * fVar237;
            fVar104 = fStack_1dc * fVar228 +
                      fStack_36c * fVar177 + fVar201 * fVar223 + fVar109 * fVar246;
            auVar268._0_8_ = CONCAT44(fVar136,fVar135) & 0x7fffffff7fffffff;
            auVar268._8_4_ = ABS(fVar138);
            auVar268._12_4_ = ABS(fVar145);
            auVar196._0_8_ = CONCAT44(fVar212,fVar200) & 0x7fffffff7fffffff;
            auVar196._8_4_ = ABS(fVar213);
            auVar196._12_4_ = ABS(fVar292);
            auVar75 = maxps(auVar268,auVar196);
            auVar280._0_8_ =
                 CONCAT44(fVar73 * fVar176 +
                          fVar137 * fVar199 + fVar161 * fStack_294 + fVar204 * fStack_364,
                          fVar146 * fVar176 +
                          fVar134 * fVar199 + fVar160 * local_298 + fVar173 * local_368) &
                 0x7fffffff7fffffff;
            auVar280._8_4_ =
                 ABS(fVar103 * fVar176 +
                     fVar144 * fVar199 + fVar162 * fStack_290 + fVar209 * fStack_360);
            auVar280._12_4_ =
                 ABS(fVar132 * fVar176 +
                     fVar149 * fVar199 + fVar172 * fStack_28c + fVar211 * fStack_35c);
            auVar75 = maxps(auVar75,auVar280);
            uVar67 = -(uint)(local_448 <= auVar75._0_4_);
            uVar69 = -(uint)(local_448 <= auVar75._4_4_);
            uVar70 = -(uint)(local_448 <= auVar75._8_4_);
            uVar71 = -(uint)(local_448 <= auVar75._12_4_);
            auVar197._0_4_ = ~uVar67 & (uint)fVar261;
            auVar197._4_4_ = ~uVar69 & (uint)fVar269;
            auVar197._8_4_ = ~uVar70 & (uint)fVar271;
            auVar197._12_4_ = ~uVar71 & (uint)fVar273;
            auVar257._0_4_ = (uint)fVar135 & uVar67;
            auVar257._4_4_ = (uint)fVar136 & uVar69;
            auVar257._8_4_ = (uint)fVar138 & uVar70;
            auVar257._12_4_ = (uint)fVar145 & uVar71;
            auVar257 = auVar257 | auVar197;
            fVar161 = (float)(~uVar67 & (uint)fVar251 | (uint)fVar200 & uVar67);
            fVar172 = (float)(~uVar69 & (uint)fVar258 | (uint)fVar212 & uVar69);
            fVar200 = (float)(~uVar70 & (uint)fVar259 | (uint)fVar213 & uVar70);
            fVar212 = (float)(~uVar71 & (uint)fVar260 | (uint)fVar292 & uVar71);
            auVar281._0_8_ = CONCAT44(fVar148,fVar147) & 0x7fffffff7fffffff;
            auVar281._8_4_ = ABS(fVar238);
            auVar281._12_4_ = ABS(fVar247);
            auVar141._0_8_ = CONCAT44(fVar274,fVar272) & 0x7fffffff7fffffff;
            auVar141._8_4_ = ABS(fVar74);
            auVar141._12_4_ = ABS(fVar104);
            auVar75 = maxps(auVar281,auVar141);
            auVar98._0_8_ =
                 CONCAT44(fVar221 * fVar176 +
                          fVar174 * fVar199 + fVar236 * fStack_294 + fVar227 * fStack_364,
                          fVar214 * fVar176 +
                          fVar248 * fVar199 + fVar235 * local_298 + fVar226 * local_368) &
                 0x7fffffff7fffffff;
            auVar98._8_4_ =
                 ABS(fVar222 * fVar176 +
                     fVar175 * fVar199 + fVar275 * fStack_290 + fVar237 * fStack_360);
            auVar98._12_4_ =
                 ABS(fVar228 * fVar176 +
                     fVar177 * fVar199 + fVar223 * fStack_28c + fVar246 * fStack_35c);
            auVar75 = maxps(auVar75,auVar98);
            uVar67 = -(uint)(local_448 <= auVar75._0_4_);
            uVar69 = -(uint)(local_448 <= auVar75._4_4_);
            uVar70 = -(uint)(local_448 <= auVar75._8_4_);
            uVar71 = -(uint)(local_448 <= auVar75._12_4_);
            fVar235 = (float)((uint)fVar147 & uVar67 | ~uVar67 & (uint)fVar261);
            fVar236 = (float)((uint)fVar148 & uVar69 | ~uVar69 & (uint)fVar269);
            fVar275 = (float)((uint)fVar238 & uVar70 | ~uVar70 & (uint)fVar271);
            fVar223 = (float)((uint)fVar247 & uVar71 | ~uVar71 & (uint)fVar273);
            fVar214 = (float)(~uVar67 & (uint)fVar251 | (uint)fVar272 & uVar67);
            fVar221 = (float)(~uVar69 & (uint)fVar258 | (uint)fVar274 & uVar69);
            fVar222 = (float)(~uVar70 & (uint)fVar259 | (uint)fVar74 & uVar70);
            fVar228 = (float)(~uVar71 & (uint)fVar260 | (uint)fVar104 & uVar71);
            fVar149 = auVar257._0_4_;
            fVar146 = auVar257._4_4_;
            fVar73 = auVar257._8_4_;
            fVar103 = auVar257._12_4_;
            auVar168._0_4_ = fVar161 * fVar161 + fVar149 * fVar149;
            auVar168._4_4_ = fVar172 * fVar172 + fVar146 * fVar146;
            auVar168._8_4_ = fVar200 * fVar200 + fVar73 * fVar73;
            auVar168._12_4_ = fVar212 * fVar212 + fVar103 * fVar103;
            auVar75 = rsqrtps(auVar197,auVar168);
            fVar132 = auVar75._0_4_;
            fVar134 = auVar75._4_4_;
            fVar137 = auVar75._8_4_;
            fVar144 = auVar75._12_4_;
            auVar198._0_4_ = fVar132 * fVar132 * auVar168._0_4_ * 0.5 * fVar132;
            auVar198._4_4_ = fVar134 * fVar134 * auVar168._4_4_ * 0.5 * fVar134;
            auVar198._8_4_ = fVar137 * fVar137 * auVar168._8_4_ * 0.5 * fVar137;
            auVar198._12_4_ = fVar144 * fVar144 * auVar168._12_4_ * 0.5 * fVar144;
            fVar173 = fVar132 * 1.5 - auVar198._0_4_;
            fVar204 = fVar134 * 1.5 - auVar198._4_4_;
            fVar209 = fVar137 * 1.5 - auVar198._8_4_;
            fVar211 = fVar144 * 1.5 - auVar198._12_4_;
            auVar169._0_4_ = fVar214 * fVar214 + fVar235 * fVar235;
            auVar169._4_4_ = fVar221 * fVar221 + fVar236 * fVar236;
            auVar169._8_4_ = fVar222 * fVar222 + fVar275 * fVar275;
            auVar169._12_4_ = fVar228 * fVar228 + fVar223 * fVar223;
            auVar75 = rsqrtps(auVar198,auVar169);
            fVar132 = auVar75._0_4_;
            fVar134 = auVar75._4_4_;
            fVar137 = auVar75._8_4_;
            fVar144 = auVar75._12_4_;
            fVar160 = fVar132 * 1.5 - fVar132 * fVar132 * auVar169._0_4_ * 0.5 * fVar132;
            fVar134 = fVar134 * 1.5 - fVar134 * fVar134 * auVar169._4_4_ * 0.5 * fVar134;
            fVar162 = fVar137 * 1.5 - fVar137 * fVar137 * auVar169._8_4_ * 0.5 * fVar137;
            fVar144 = fVar144 * 1.5 - fVar144 * fVar144 * auVar169._12_4_ * 0.5 * fVar144;
            fVar260 = fVar161 * fVar173 * auVar279._0_4_;
            fVar261 = fVar172 * fVar204 * auVar279._4_4_;
            fVar269 = fVar200 * fVar209 * auVar279._8_4_;
            fVar135 = fVar212 * fVar211 * auVar279._12_4_;
            fVar137 = -fVar149 * fVar173 * auVar279._0_4_;
            fVar149 = -fVar146 * fVar204 * auVar279._4_4_;
            fVar161 = -fVar73 * fVar209 * auVar279._8_4_;
            fVar172 = -fVar103 * fVar211 * auVar279._12_4_;
            fVar227 = fVar173 * 0.0 * auVar279._0_4_;
            fVar246 = fVar204 * 0.0 * auVar279._4_4_;
            fVar251 = fVar209 * 0.0 * auVar279._8_4_;
            fVar259 = fVar211 * 0.0 * auVar279._12_4_;
            fVar173 = fVar214 * fVar160 * auVar287._0_4_;
            fVar204 = fVar221 * fVar134 * auVar287._4_4_;
            fVar209 = fVar222 * fVar162 * auVar287._8_4_;
            fVar211 = fVar228 * fVar144 * auVar287._12_4_;
            fVar174 = fVar276 + fVar173;
            fVar175 = fVar282 + fVar204;
            fVar177 = fVar283 + fVar209;
            fVar200 = fVar284 + fVar211;
            fVar146 = -fVar235 * fVar160 * auVar287._0_4_;
            fVar73 = -fVar236 * fVar134 * auVar287._4_4_;
            fVar103 = -fVar275 * fVar162 * auVar287._8_4_;
            fVar132 = -fVar223 * fVar144 * auVar287._12_4_;
            fVar212 = fVar202 + fVar146;
            fVar213 = fVar203 + fVar73;
            fVar292 = fVar205 + fVar103;
            fVar272 = fVar210 + fVar132;
            fVar221 = fVar160 * 0.0 * auVar287._0_4_;
            fVar228 = fVar134 * 0.0 * auVar287._4_4_;
            fVar236 = fVar162 * 0.0 * auVar287._8_4_;
            fVar223 = fVar144 * 0.0 * auVar287._12_4_;
            fVar214 = local_248 - fVar260;
            fVar222 = fStack_244 - fVar261;
            fVar235 = fStack_240 - fVar269;
            fVar275 = fStack_23c - fVar135;
            fVar274 = fVar294 + fVar221;
            fVar74 = fVar296 + fVar228;
            fVar104 = fVar298 + fVar236;
            fVar136 = fVar270 + fVar223;
            fVar134 = local_258 - fVar137;
            fVar144 = fStack_254 - fVar149;
            fVar160 = fStack_250 - fVar161;
            fVar162 = fStack_24c - fVar172;
            fVar226 = fVar106 - fVar227;
            fVar237 = fVar108 - fVar246;
            fVar248 = fVar110 - fVar251;
            fVar258 = fVar133 - fVar259;
            uVar67 = -(uint)(0.0 < (fVar134 * (fVar274 - fVar226) - fVar226 * (fVar212 - fVar134)) *
                                   0.0 + (fVar226 * (fVar174 - fVar214) -
                                         (fVar274 - fVar226) * fVar214) * 0.0 +
                                         ((fVar212 - fVar134) * fVar214 -
                                         (fVar174 - fVar214) * fVar134));
            uVar69 = -(uint)(0.0 < (fVar144 * (fVar74 - fVar237) - fVar237 * (fVar213 - fVar144)) *
                                   0.0 + (fVar237 * (fVar175 - fVar222) -
                                         (fVar74 - fVar237) * fVar222) * 0.0 +
                                         ((fVar213 - fVar144) * fVar222 -
                                         (fVar175 - fVar222) * fVar144));
            uVar70 = -(uint)(0.0 < (fVar160 * (fVar104 - fVar248) - fVar248 * (fVar292 - fVar160)) *
                                   0.0 + (fVar248 * (fVar177 - fVar235) -
                                         (fVar104 - fVar248) * fVar235) * 0.0 +
                                         ((fVar292 - fVar160) * fVar235 -
                                         (fVar177 - fVar235) * fVar160));
            uVar71 = -(uint)(0.0 < (fVar162 * (fVar136 - fVar258) - fVar258 * (fVar272 - fVar162)) *
                                   0.0 + (fVar258 * (fVar200 - fVar275) -
                                         (fVar136 - fVar258) * fVar275) * 0.0 +
                                         ((fVar272 - fVar162) * fVar275 -
                                         (fVar200 - fVar275) * fVar162));
            fVar138 = (float)((uint)(fVar276 - fVar173) & uVar67 |
                             ~uVar67 & (uint)(local_248 + fVar260));
            fVar145 = (float)((uint)(fVar282 - fVar204) & uVar69 |
                             ~uVar69 & (uint)(fStack_244 + fVar261));
            fVar147 = (float)((uint)(fVar283 - fVar209) & uVar70 |
                             ~uVar70 & (uint)(fStack_240 + fVar269));
            fVar135 = (float)((uint)(fVar284 - fVar211) & uVar71 |
                             ~uVar71 & (uint)(fStack_23c + fVar135));
            fVar173 = (float)((uint)(fVar202 - fVar146) & uVar67 |
                             ~uVar67 & (uint)(local_258 + fVar137));
            fVar204 = (float)((uint)(fVar203 - fVar73) & uVar69 |
                             ~uVar69 & (uint)(fStack_254 + fVar149));
            fVar209 = (float)((uint)(fVar205 - fVar103) & uVar70 |
                             ~uVar70 & (uint)(fStack_250 + fVar161));
            fVar211 = (float)((uint)(fVar210 - fVar132) & uVar71 |
                             ~uVar71 & (uint)(fStack_24c + fVar172));
            fVar260 = (float)((uint)(fVar294 - fVar221) & uVar67 |
                             ~uVar67 & (uint)(fVar106 + fVar227));
            fVar261 = (float)((uint)(fVar296 - fVar228) & uVar69 |
                             ~uVar69 & (uint)(fVar108 + fVar246));
            fVar269 = (float)((uint)(fVar298 - fVar236) & uVar70 |
                             ~uVar70 & (uint)(fVar110 + fVar251));
            fVar276 = (float)((uint)(fVar270 - fVar223) & uVar71 |
                             ~uVar71 & (uint)(fVar133 + fVar259));
            fVar221 = (float)((uint)fVar214 & uVar67 | ~uVar67 & (uint)fVar174);
            fVar228 = (float)((uint)fVar222 & uVar69 | ~uVar69 & (uint)fVar175);
            fVar236 = (float)((uint)fVar235 & uVar70 | ~uVar70 & (uint)fVar177);
            fVar223 = (float)((uint)fVar275 & uVar71 | ~uVar71 & (uint)fVar200);
            fVar137 = (float)((uint)fVar134 & uVar67 | ~uVar67 & (uint)fVar212);
            fVar149 = (float)((uint)fVar144 & uVar69 | ~uVar69 & (uint)fVar213);
            fVar161 = (float)((uint)fVar160 & uVar70 | ~uVar70 & (uint)fVar292);
            fVar172 = (float)((uint)fVar162 & uVar71 | ~uVar71 & (uint)fVar272);
            fVar227 = (float)((uint)fVar226 & uVar67 | ~uVar67 & (uint)fVar274);
            fVar246 = (float)((uint)fVar237 & uVar69 | ~uVar69 & (uint)fVar74);
            fVar251 = (float)((uint)fVar248 & uVar70 | ~uVar70 & (uint)fVar104);
            fVar259 = (float)((uint)fVar258 & uVar71 | ~uVar71 & (uint)fVar136);
            fVar214 = (float)((uint)fVar174 & uVar67 | ~uVar67 & (uint)fVar214) - fVar138;
            fVar222 = (float)((uint)fVar175 & uVar69 | ~uVar69 & (uint)fVar222) - fVar145;
            fVar235 = (float)((uint)fVar177 & uVar70 | ~uVar70 & (uint)fVar235) - fVar147;
            fVar275 = (float)((uint)fVar200 & uVar71 | ~uVar71 & (uint)fVar275) - fVar135;
            fVar282 = (float)((uint)fVar212 & uVar67 | ~uVar67 & (uint)fVar134) - fVar173;
            fVar283 = (float)((uint)fVar213 & uVar69 | ~uVar69 & (uint)fVar144) - fVar204;
            fVar284 = (float)((uint)fVar292 & uVar70 | ~uVar70 & (uint)fVar160) - fVar209;
            fVar174 = (float)((uint)fVar272 & uVar71 | ~uVar71 & (uint)fVar162) - fVar211;
            fVar226 = (float)((uint)fVar274 & uVar67 | ~uVar67 & (uint)fVar226) - fVar260;
            fVar237 = (float)((uint)fVar74 & uVar69 | ~uVar69 & (uint)fVar237) - fVar261;
            fVar248 = (float)((uint)fVar104 & uVar70 | ~uVar70 & (uint)fVar248) - fVar269;
            fVar258 = (float)((uint)fVar136 & uVar71 | ~uVar71 & (uint)fVar258) - fVar276;
            fVar203 = fVar138 - fVar221;
            fVar205 = fVar145 - fVar228;
            fVar210 = fVar147 - fVar236;
            fVar212 = fVar135 - fVar223;
            fVar146 = fVar173 - fVar137;
            fVar73 = fVar204 - fVar149;
            fVar103 = fVar209 - fVar161;
            fVar132 = fVar211 - fVar172;
            fVar134 = fVar260 - fVar227;
            fVar144 = fVar261 - fVar246;
            fVar160 = fVar269 - fVar251;
            fVar162 = fVar276 - fVar259;
            fVar175 = (fVar173 * fVar226 - fVar260 * fVar282) * 0.0 +
                      (fVar260 * fVar214 - fVar138 * fVar226) * 0.0 +
                      (fVar138 * fVar282 - fVar173 * fVar214);
            fVar177 = (fVar204 * fVar237 - fVar261 * fVar283) * 0.0 +
                      (fVar261 * fVar222 - fVar145 * fVar237) * 0.0 +
                      (fVar145 * fVar283 - fVar204 * fVar222);
            auVar158._4_4_ = fVar177;
            auVar158._0_4_ = fVar175;
            fVar200 = (fVar209 * fVar248 - fVar269 * fVar284) * 0.0 +
                      (fVar269 * fVar235 - fVar147 * fVar248) * 0.0 +
                      (fVar147 * fVar284 - fVar209 * fVar235);
            fVar202 = (fVar211 * fVar258 - fVar276 * fVar174) * 0.0 +
                      (fVar276 * fVar275 - fVar135 * fVar258) * 0.0 +
                      (fVar135 * fVar174 - fVar211 * fVar275);
            auVar288._0_4_ =
                 (fVar137 * fVar134 - fVar227 * fVar146) * 0.0 +
                 (fVar227 * fVar203 - fVar221 * fVar134) * 0.0 +
                 (fVar221 * fVar146 - fVar137 * fVar203);
            auVar288._4_4_ =
                 (fVar149 * fVar144 - fVar246 * fVar73) * 0.0 +
                 (fVar246 * fVar205 - fVar228 * fVar144) * 0.0 +
                 (fVar228 * fVar73 - fVar149 * fVar205);
            auVar288._8_4_ =
                 (fVar161 * fVar160 - fVar251 * fVar103) * 0.0 +
                 (fVar251 * fVar210 - fVar236 * fVar160) * 0.0 +
                 (fVar236 * fVar103 - fVar161 * fVar210);
            auVar288._12_4_ =
                 (fVar172 * fVar162 - fVar259 * fVar132) * 0.0 +
                 (fVar259 * fVar212 - fVar223 * fVar162) * 0.0 +
                 (fVar223 * fVar132 - fVar172 * fVar212);
            auVar158._8_4_ = fVar200;
            auVar158._12_4_ = fVar202;
            auVar75 = maxps(auVar158,auVar288);
            bVar48 = auVar75._0_4_ <= 0.0 && bVar48;
            auVar159._0_4_ = -(uint)bVar48;
            bVar49 = auVar75._4_4_ <= 0.0 && bVar49;
            auVar159._4_4_ = -(uint)bVar49;
            bVar50 = auVar75._8_4_ <= 0.0 && bVar50;
            auVar159._8_4_ = -(uint)bVar50;
            bVar51 = auVar75._12_4_ <= 0.0 && bVar51;
            auVar159._12_4_ = -(uint)bVar51;
            iVar53 = movmskps((int)(catmullrom_basis1 + lVar23),auVar159);
            if (iVar53 == 0) {
LAB_00b4e1de:
              auVar143._8_8_ = uStack_3a0;
              auVar143._0_8_ = local_3a8;
            }
            else {
              fVar161 = fVar146 * fVar226 - fVar134 * fVar282;
              fVar172 = fVar73 * fVar237 - fVar144 * fVar283;
              fVar221 = fVar103 * fVar248 - fVar160 * fVar284;
              fVar228 = fVar132 * fVar258 - fVar162 * fVar174;
              fVar137 = fVar134 * fVar214 - fVar226 * fVar203;
              fVar144 = fVar144 * fVar222 - fVar237 * fVar205;
              fVar149 = fVar160 * fVar235 - fVar248 * fVar210;
              fVar160 = fVar162 * fVar275 - fVar258 * fVar212;
              fVar146 = fVar203 * fVar282 - fVar146 * fVar214;
              fVar162 = fVar205 * fVar283 - fVar73 * fVar222;
              fVar214 = fVar210 * fVar284 - fVar103 * fVar235;
              fVar222 = fVar212 * fVar174 - fVar132 * fVar275;
              auVar142._0_4_ = fVar137 * 0.0 + fVar146;
              auVar142._4_4_ = fVar144 * 0.0 + fVar162;
              auVar142._8_4_ = fVar149 * 0.0 + fVar214;
              auVar142._12_4_ = fVar160 * 0.0 + fVar222;
              auVar208._0_4_ = fVar161 * 0.0 + auVar142._0_4_;
              auVar208._4_4_ = fVar172 * 0.0 + auVar142._4_4_;
              auVar208._8_4_ = fVar221 * 0.0 + auVar142._8_4_;
              auVar208._12_4_ = fVar228 * 0.0 + auVar142._12_4_;
              auVar75 = rcpps(auVar142,auVar208);
              fVar73 = auVar75._0_4_;
              fVar103 = auVar75._4_4_;
              fVar132 = auVar75._8_4_;
              fVar134 = auVar75._12_4_;
              fVar73 = (1.0 - auVar208._0_4_ * fVar73) * fVar73 + fVar73;
              fVar103 = (1.0 - auVar208._4_4_ * fVar103) * fVar103 + fVar103;
              fVar132 = (1.0 - auVar208._8_4_ * fVar132) * fVar132 + fVar132;
              fVar134 = (1.0 - auVar208._12_4_ * fVar134) * fVar134 + fVar134;
              fVar137 = (fVar260 * fVar146 + fVar173 * fVar137 + fVar138 * fVar161) * fVar73;
              fVar144 = (fVar261 * fVar162 + fVar204 * fVar144 + fVar145 * fVar172) * fVar103;
              fVar149 = (fVar269 * fVar214 + fVar209 * fVar149 + fVar147 * fVar221) * fVar132;
              fVar160 = (fVar276 * fVar222 + fVar211 * fVar160 + fVar135 * fVar228) * fVar134;
              fVar146 = *(float *)(ray + k * 4 + 0x80);
              bVar48 = ((float)local_2a8._0_4_ <= fVar137 && fVar137 <= fVar146) && bVar48;
              auVar170._0_4_ = -(uint)bVar48;
              bVar49 = ((float)local_2a8._4_4_ <= fVar144 && fVar144 <= fVar146) && bVar49;
              auVar170._4_4_ = -(uint)bVar49;
              bVar50 = (fStack_2a0 <= fVar149 && fVar149 <= fVar146) && bVar50;
              auVar170._8_4_ = -(uint)bVar50;
              bVar51 = (fStack_29c <= fVar160 && fVar160 <= fVar146) && bVar51;
              auVar170._12_4_ = -(uint)bVar51;
              iVar53 = movmskps(iVar53,auVar170);
              if (iVar53 == 0) goto LAB_00b4e1de;
              auVar171._0_8_ =
                   CONCAT44(-(uint)(auVar208._4_4_ != 0.0 && bVar49),
                            -(uint)(auVar208._0_4_ != 0.0 && bVar48));
              auVar171._8_4_ = -(uint)(auVar208._8_4_ != 0.0 && bVar50);
              auVar171._12_4_ = -(uint)(auVar208._12_4_ != 0.0 && bVar51);
              iVar53 = movmskps(iVar53,auVar171);
              auVar143._8_8_ = uStack_3a0;
              auVar143._0_8_ = local_3a8;
              if (iVar53 != 0) {
                fVar175 = fVar175 * fVar73;
                fVar177 = fVar177 * fVar103;
                fVar200 = fVar200 * fVar132;
                fVar202 = fVar202 * fVar134;
                local_498 = (float)((uint)(1.0 - fVar175) & uVar67 | ~uVar67 & (uint)fVar175);
                fStack_494 = (float)((uint)(1.0 - fVar177) & uVar69 | ~uVar69 & (uint)fVar177);
                fStack_490 = (float)((uint)(1.0 - fVar200) & uVar70 | ~uVar70 & (uint)fVar200);
                fStack_48c = (float)((uint)(1.0 - fVar202) & uVar71 | ~uVar71 & (uint)fVar202);
                local_288 = (float)(~uVar67 & (uint)(auVar288._0_4_ * fVar73) |
                                   (uint)(1.0 - auVar288._0_4_ * fVar73) & uVar67);
                fStack_284 = (float)(~uVar69 & (uint)(auVar288._4_4_ * fVar103) |
                                    (uint)(1.0 - auVar288._4_4_ * fVar103) & uVar69);
                fStack_280 = (float)(~uVar70 & (uint)(auVar288._8_4_ * fVar132) |
                                    (uint)(1.0 - auVar288._8_4_ * fVar132) & uVar70);
                fStack_27c = (float)(~uVar71 & (uint)(auVar288._12_4_ * fVar134) |
                                    (uint)(1.0 - auVar288._12_4_ * fVar134) & uVar71);
                auVar143._8_4_ = auVar171._8_4_;
                auVar143._0_8_ = auVar171._0_8_;
                auVar143._12_4_ = auVar171._12_4_;
                local_4a8 = fVar137;
                fStack_4a4 = fVar144;
                fStack_4a0 = fVar149;
                fStack_49c = fVar160;
              }
            }
            iVar53 = movmskps(iVar53,auVar143);
            fStack_2f0 = fVar271;
            fStack_2ec = fVar273;
            _local_268 = auVar220;
            if (iVar53 != 0) {
              fVar73 = (auVar287._0_4_ - auVar279._0_4_) * local_498 + auVar279._0_4_;
              fVar103 = (auVar287._4_4_ - auVar279._4_4_) * fStack_494 + auVar279._4_4_;
              fVar132 = (auVar287._8_4_ - auVar279._8_4_) * fStack_490 + auVar279._8_4_;
              fVar134 = (auVar287._12_4_ - auVar279._12_4_) * fStack_48c + auVar279._12_4_;
              fVar146 = *(float *)((long)local_340->ray_space + k * 4 + -0x10);
              auVar99._0_4_ = -(uint)(fVar146 * (fVar73 + fVar73) < local_4a8) & auVar143._0_4_;
              auVar99._4_4_ = -(uint)(fVar146 * (fVar103 + fVar103) < fStack_4a4) & auVar143._4_4_;
              auVar99._8_4_ = -(uint)(fVar146 * (fVar132 + fVar132) < fStack_4a0) & auVar143._8_4_;
              auVar99._12_4_ = -(uint)(fVar146 * (fVar134 + fVar134) < fStack_49c) & auVar143._12_4_
              ;
              uVar67 = movmskps((int)local_340,auVar99);
              if (uVar67 != 0) {
                local_288 = local_288 + local_288 + -1.0;
                fStack_284 = fStack_284 + fStack_284 + -1.0;
                fStack_280 = fStack_280 + fStack_280 + -1.0;
                fStack_27c = fStack_27c + fStack_27c + -1.0;
                local_188 = CONCAT44(fStack_2c4,local_2c8);
                uStack_180 = CONCAT44(fStack_2bc,fStack_2c0);
                local_178 = CONCAT44(fStack_2d4,local_2d8);
                uStack_170 = CONCAT44(fStack_2cc,fStack_2d0);
                local_168 = CONCAT44(fStack_2e4,local_2e8);
                uStack_160 = CONCAT44(fStack_2dc,fStack_2e0);
                local_158 = CONCAT44(fStack_2b4,local_2b8);
                uStack_150 = CONCAT44(fStack_2ac,fStack_2b0);
                pGVar61 = (context->scene->geometries).items[local_3b0].ptr;
                local_1c8 = local_498;
                fStack_1c4 = fStack_494;
                fStack_1c0 = fStack_490;
                fStack_1bc = fStack_48c;
                local_1b8 = local_288;
                fStack_1b4 = fStack_284;
                fStack_1b0 = fStack_280;
                fStack_1ac = fStack_27c;
                local_1a8 = local_4a8;
                fStack_1a4 = fStack_4a4;
                fStack_1a0 = fStack_4a0;
                fStack_19c = fStack_49c;
                local_198 = uVar68;
                local_148 = auVar99;
                if ((pGVar61->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                  puVar59 = (undefined1 *)0x0;
                  local_194 = iVar19;
                }
                else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                        (puVar59 = (undefined1 *)CONCAT71((int7)((ulong)context->args >> 8),1),
                        local_194 = iVar19, pGVar61->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                  fVar146 = (float)(int)uVar68;
                  local_138[0] = (fVar146 + local_498 + 0.0) * local_78;
                  local_138[1] = (fVar146 + fStack_494 + 1.0) * fStack_74;
                  local_138[2] = (fVar146 + fStack_490 + 2.0) * fStack_70;
                  local_138[3] = (fVar146 + fStack_48c + 3.0) * fStack_6c;
                  local_128 = CONCAT44(fStack_284,local_288);
                  uStack_120 = CONCAT44(fStack_27c,fStack_280);
                  local_118[0] = local_4a8;
                  local_118[1] = fStack_4a4;
                  local_118[2] = fStack_4a0;
                  local_118[3] = fStack_49c;
                  uVar64 = (ulong)(uVar67 & 0xff);
                  uVar62 = 0;
                  if (uVar64 != 0) {
                    for (; ((uVar67 & 0xff) >> uVar62 & 1) == 0; uVar62 = uVar62 + 1) {
                    }
                  }
                  auVar27 = *(undefined1 (*) [12])*local_348;
                  uStack_46c = (undefined4)((ulong)*(undefined8 *)(*local_348 + 8) >> 0x20);
                  uVar57 = *(undefined4 *)(ray + k * 4 + 0x80);
                  local_194 = iVar19;
                  do {
                    local_d8 = local_138[uVar62];
                    local_c8 = *(undefined4 *)((long)&local_128 + uVar62 * 4);
                    *(float *)(ray + k * 4 + 0x80) = local_118[uVar62];
                    fVar134 = 1.0 - local_d8;
                    fVar146 = local_d8 * 3.0;
                    fVar132 = ((fVar146 + 2.0) * (fVar134 + fVar134) + fVar134 * -3.0 * fVar134) *
                              0.5;
                    fVar73 = (local_d8 * local_d8 + fVar134 * -2.0 * local_d8) * 0.5;
                    fVar103 = (local_d8 * fVar146 + (fVar146 + -5.0) * (local_d8 + local_d8)) * 0.5;
                    local_338.context = context->user;
                    fVar146 = (local_d8 * (fVar134 + fVar134) - fVar134 * fVar134) * 0.5;
                    local_108 = fVar146 * local_2c8 +
                                fVar103 * local_2d8 + fVar132 * local_2e8 + fVar73 * local_2b8;
                    local_f8 = fVar146 * fStack_2c4 +
                               fVar103 * fStack_2d4 + fVar132 * fStack_2e4 + fVar73 * fStack_2b4;
                    local_e8 = fVar146 * fStack_2c0 +
                               fVar103 * fStack_2d0 + fVar132 * fStack_2e0 + fVar73 * fStack_2b0;
                    fStack_104 = local_108;
                    fStack_100 = local_108;
                    fStack_fc = local_108;
                    fStack_f4 = local_f8;
                    fStack_f0 = local_f8;
                    fStack_ec = local_f8;
                    fStack_e4 = local_e8;
                    fStack_e0 = local_e8;
                    fStack_dc = local_e8;
                    fStack_d4 = local_d8;
                    fStack_d0 = local_d8;
                    fStack_cc = local_d8;
                    uStack_c4 = local_c8;
                    uStack_c0 = local_c8;
                    uStack_bc = local_c8;
                    local_b8 = CONCAT44(uStack_64,local_68);
                    uStack_b0 = CONCAT44(uStack_5c,uStack_60);
                    local_a8 = local_308._0_8_;
                    uStack_a0 = local_308._8_8_;
                    local_98 = (local_338.context)->instID[0];
                    uStack_94 = local_98;
                    uStack_90 = local_98;
                    uStack_8c = local_98;
                    local_88 = (local_338.context)->instPrimID[0];
                    uStack_84 = local_88;
                    uStack_80 = local_88;
                    uStack_7c = local_88;
                    local_3c8._12_4_ = uStack_46c;
                    local_3c8._0_12_ = auVar27;
                    local_338.valid = (int *)local_3c8;
                    pRVar58 = (RTCIntersectArguments *)pGVar61->userPtr;
                    local_338.hit = (RTCHitN *)&local_108;
                    local_338.N = 4;
                    p_Var55 = pGVar61->occlusionFilterN;
                    local_338.geometryUserPtr = pRVar58;
                    local_338.ray = (RTCRayN *)ray;
                    if (p_Var55 != (RTCFilterFunctionN)0x0) {
                      p_Var55 = (RTCFilterFunctionN)(*p_Var55)(&local_338);
                    }
                    auVar130._0_4_ = -(uint)(local_3c8._0_4_ == 0);
                    auVar130._4_4_ = -(uint)(local_3c8._4_4_ == 0);
                    auVar130._8_4_ = -(uint)(local_3c8._8_4_ == 0);
                    auVar130._12_4_ = -(uint)(local_3c8._12_4_ == 0);
                    uVar67 = movmskps((int)p_Var55,auVar130);
                    pRVar56 = (RTCRayN *)(ulong)(uVar67 ^ 0xf);
                    if ((uVar67 ^ 0xf) == 0) {
                      auVar130 = auVar130 ^ _DAT_01f7ae20;
                    }
                    else {
                      pRVar58 = context->args;
                      if ((pRVar58->filter != (RTCFilterFunctionN)0x0) &&
                         (((pRVar58->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar61->field_8).field_0x2 & 0x40) != 0)))) {
                        (*pRVar58->filter)(&local_338);
                      }
                      auVar100._0_4_ = -(uint)(local_3c8._0_4_ == 0);
                      auVar100._4_4_ = -(uint)(local_3c8._4_4_ == 0);
                      auVar100._8_4_ = -(uint)(local_3c8._8_4_ == 0);
                      auVar100._12_4_ = -(uint)(local_3c8._12_4_ == 0);
                      auVar130 = auVar100 ^ _DAT_01f7ae20;
                      *(undefined1 (*) [16])(local_338.ray + 0x80) =
                           ~auVar100 & _DAT_01f7aa00 |
                           *(undefined1 (*) [16])(local_338.ray + 0x80) & auVar100;
                      pRVar56 = local_338.ray;
                    }
                    auVar131._0_4_ = auVar130._0_4_ << 0x1f;
                    auVar131._4_4_ = auVar130._4_4_ << 0x1f;
                    auVar131._8_4_ = auVar130._8_4_ << 0x1f;
                    auVar131._12_4_ = auVar130._12_4_ << 0x1f;
                    iVar53 = movmskps((int)pRVar56,auVar131);
                    if (iVar53 != 0) {
                      puVar59 = (undefined1 *)CONCAT71((int7)((ulong)pRVar58 >> 8),1);
                      break;
                    }
                    *(undefined4 *)(ray + k * 4 + 0x80) = uVar57;
                    uVar64 = uVar64 ^ 1L << (uVar62 & 0x3f);
                    uVar62 = 0;
                    if (uVar64 != 0) {
                      for (; (uVar64 >> uVar62 & 1) == 0; uVar62 = uVar62 + 1) {
                      }
                    }
                    puVar59 = (undefined1 *)0x0;
                  } while (uVar64 != 0);
                }
                bVar63 = (bool)(bVar63 | (byte)puVar59);
              }
            }
          }
          uVar57 = SUB84(puVar59,0);
          lVar65 = lVar65 + 4;
        } while ((int)lVar65 < iVar19);
      }
      if (bVar63 != false) {
        return bVar63;
      }
      fVar146 = *(float *)(ray + k * 4 + 0x80);
      auVar129._4_4_ = -(uint)(fStack_44 <= fVar146);
      auVar129._0_4_ = -(uint)(local_48 <= fVar146);
      auVar129._8_4_ = -(uint)(fStack_40 <= fVar146);
      auVar129._12_4_ = -(uint)(fStack_3c <= fVar146);
      uVar67 = movmskps(uVar57,auVar129);
      uVar66 = uVar66 & uVar66 + 0xf & uVar67;
    } while (uVar66 != 0);
  }
  return false;
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }